

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_mgga_inc.c
# Opt level: O2

void work_mgga_vxc_pol(xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,double *tau,
                      xc_mgga_out_params *out)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  undefined1 auVar118 [16];
  double dVar143;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  double dVar144;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  double __x;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  double dVar203;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  double dVar243;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  double dVar256;
  double dVar259;
  double dVar260;
  double dVar261;
  double dVar262;
  double dVar263;
  double dVar264;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  double dVar257;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  double dVar258;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  double dVar284;
  double dVar291;
  double dVar292;
  double dVar293;
  double dVar321;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  double dVar285;
  double dVar286;
  double dVar287;
  undefined1 auVar297 [16];
  double dVar288;
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  double dVar289;
  double dVar290;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  double dVar322;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  double dVar323;
  undefined1 auVar305 [16];
  double dVar324;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  double dVar325;
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  double dVar326;
  double dVar327;
  double dVar329;
  double dVar330;
  double dVar331;
  double dVar332;
  double dVar333;
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  double dVar328;
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  double dVar350;
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  double dVar351;
  double dVar352;
  double dVar353;
  double dVar354;
  double dVar355;
  double dVar356;
  double dVar357;
  double dVar358;
  double dVar374;
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  double dVar375;
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  double dVar376;
  double dVar377;
  double dVar378;
  double dVar379;
  double dVar380;
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  double dVar390;
  double dVar391;
  double dVar392;
  double dVar393;
  double dVar394;
  double dVar395;
  double dVar396;
  double dVar397;
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  double dVar406;
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  double dVar407;
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  double dVar408;
  double dVar409;
  double dVar410;
  double dVar411;
  double dVar412;
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  double dVar417;
  double dVar418;
  double dVar419;
  double dVar420;
  double dVar421;
  double dVar422;
  double dVar423;
  double dVar424;
  double dVar425;
  undefined1 auVar426 [16];
  double dVar431;
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  double dVar432;
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  double dVar433;
  double dVar434;
  double dVar435;
  double dVar436;
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  double dVar441;
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  double dVar442;
  double dVar443;
  double dVar444;
  double dVar445;
  double dVar446;
  double dVar453;
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  double dVar454;
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  double dVar455;
  double dVar456;
  double dVar457;
  double dVar458;
  double dVar462;
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  double dVar463;
  undefined1 auVar461 [16];
  double local_c98;
  double local_c38;
  double local_c28;
  double local_c18;
  double local_b98;
  double local_b38;
  double local_b28;
  double local_a58;
  double dStack_a50;
  double local_a28;
  double dStack_a20;
  uint local_9f8;
  uint uStack_9f4;
  double local_898;
  double dStack_890;
  double local_888;
  double local_878;
  double local_848;
  double local_838;
  double local_7f8;
  double dStack_7f0;
  double local_7a8;
  double dStack_7a0;
  double local_718;
  double dStack_710;
  double local_6f8;
  double dStack_6f0;
  undefined8 local_6b8;
  undefined1 local_638 [48];
  double local_608;
  double dStack_600;
  double local_5e8;
  double dStack_5e0;
  undefined1 local_468 [432];
  double local_2b8;
  double local_298;
  double local_288;
  uint local_188;
  uint uStack_184;
  
  local_c98 = 0.0;
  local_c18 = 0.0;
  local_b28 = 0.0;
  local_b38 = 0.0;
  for (sVar7 = 0; np != sVar7; sVar7 = sVar7 + 1) {
    lVar6 = (long)(p->dim).rho * sVar7;
    dVar22 = rho[lVar6];
    if (p->nspin == 2) {
      dVar22 = dVar22 + rho[lVar6 + 1];
    }
    dVar74 = p->dens_threshold;
    if (dVar74 <= dVar22) {
      dVar22 = rho[lVar6];
      if (rho[lVar6] <= dVar74) {
        dVar22 = dVar74;
      }
      dVar23 = p->sigma_threshold * p->sigma_threshold;
      lVar8 = (long)(p->dim).sigma * sVar7;
      local_b98 = sigma[lVar8];
      if (sigma[lVar8] <= dVar23) {
        local_b98 = dVar23;
      }
      uVar2 = p->info->flags;
      if ((uVar2 >> 0x10 & 1) != 0) {
        local_b28 = tau[(long)(p->dim).tau * sVar7];
        if (tau[(long)(p->dim).tau * sVar7] <= p->tau_threshold) {
          local_b28 = p->tau_threshold;
        }
        if (((uVar2 >> 0x11 & 1) != 0) && (dVar91 = dVar22 * 8.0 * local_b28, dVar91 <= local_b98))
        {
          local_b98 = dVar91;
        }
      }
      if (p->nspin == 2) {
        local_c98 = rho[lVar6 + 1];
        if (rho[lVar6 + 1] <= dVar74) {
          local_c98 = dVar74;
        }
        local_c18 = sigma[lVar8 + 2];
        if (sigma[lVar8 + 2] <= dVar23) {
          local_c18 = dVar23;
        }
        if ((uVar2 >> 0x10 & 1) != 0) {
          local_b38 = tau[(long)(p->dim).tau * sVar7 + 1];
          if (tau[(long)(p->dim).tau * sVar7 + 1] <= p->tau_threshold) {
            local_b38 = p->tau_threshold;
          }
          if (((uVar2 >> 0x11 & 1) != 0) &&
             (dVar23 = local_c98 * 8.0 * local_b38, dVar23 <= local_c18)) {
            local_c18 = dVar23;
          }
        }
      }
      __x = dVar22 + local_c98;
      dVar145 = 1.0 / __x;
      dVar232 = (dVar22 + dVar22) * dVar145;
      dVar23 = p->zeta_threshold;
      dVar284 = dVar23 + -1.0;
      dVar200 = (local_c98 + local_c98) * dVar145;
      dVar326 = -dVar284;
      dVar24 = dVar22 - local_c98;
      dVar351 = dVar24 * dVar145;
      uVar9 = -(ulong)(dVar200 <= dVar23);
      uVar10 = -(ulong)(dVar232 <= dVar23);
      dVar146 = (double)(uVar10 & (ulong)dVar284 |
                        ~uVar10 & (~uVar9 & (ulong)dVar351 | uVar9 & (ulong)dVar326)) + 1.0;
      dVar25 = cbrt(dVar23);
      dVar26 = cbrt(dVar146);
      uVar11 = -(ulong)(dVar146 <= dVar23);
      dVar27 = cbrt(__x);
      dVar91 = cbrt(9.0);
      dVar28 = cbrt(0.3183098861837907);
      dVar28 = dVar28 * dVar28 * dVar91 * dVar91;
      dVar92 = p->cam_omega * dVar28;
      dVar29 = 1.0 / dVar27;
      dVar30 = cbrt(9.869604401089358);
      dVar31 = 1.0 / (dVar30 * dVar30);
      dVar32 = dVar31 * 1.8171205928321397;
      dVar93 = dVar22 * dVar22;
      dVar33 = cbrt(dVar22);
      dVar94 = 1.0 / (dVar33 * dVar33);
      dVar34 = dVar94 / dVar93;
      dVar147 = local_b98 * dVar34;
      dVar95 = ((1.0 / dVar30) / 9.869604401089358) * 3.3019272488946267;
      dVar201 = (1.0 / dVar33) / (dVar22 * dVar93 * dVar93);
      dVar35 = dVar32 * 0.1504548888888889;
      dVar36 = local_b98 * local_b98 * dVar95 * 0.002689949046226295 * dVar201 +
               dVar35 * dVar147 + 1.0;
      dVar37 = pow(dVar36,0.1);
      dVar91 = p->zeta_threshold;
      uVar12 = -(ulong)(1.0 - dVar351 <= dVar91);
      uVar13 = -(ulong)(dVar351 + 1.0 <= dVar91);
      dVar38 = (double)(~uVar13 & (uVar12 & (ulong)dVar326 | ~uVar12 & (ulong)dVar351) |
                       uVar13 & (ulong)dVar284) + 1.0;
      dVar39 = cbrt(dVar38);
      uVar14 = -(ulong)(dVar38 <= dVar91);
      dVar38 = (double)(uVar14 & (ulong)dVar25 | ~uVar14 & (ulong)dVar39);
      auVar118._8_8_ = dVar38;
      auVar118._0_8_ = dVar37;
      auVar118 = divpd(_DAT_00f4add0,auVar118);
      dVar37 = auVar118._0_8_;
      dVar143 = auVar118._8_8_;
      dVar96 = dVar29 * 1.4422495703074083 * dVar92;
      dVar97 = (dVar96 * dVar37 * dVar143) / 18.0;
      dVar91 = 1e-10;
      if (1e-10 <= dVar97) {
        dVar91 = dVar97;
      }
      dVar98 = 1.35;
      if (dVar91 <= 1.35) {
        dVar98 = dVar91;
      }
      dVar40 = 1.0 / dVar98;
      dVar41 = erf(dVar40 * 0.5);
      dVar99 = dVar98 * dVar98;
      dVar42 = exp((1.0 / dVar99) * -0.25);
      dVar67 = dVar91;
      if (dVar91 <= 1.35) {
        dVar67 = 1.35;
      }
      dVar327 = dVar67 * dVar67;
      dVar352 = dVar327 * dVar327;
      dVar202 = dVar352 * dVar352;
      auVar265._0_8_ = dVar202 * dVar202;
      auVar265._8_8_ = dVar202;
      auVar118 = divpd(_DAT_00f4add0,auVar265);
      dVar256 = dVar99 * -2.0 * (dVar42 + -1.0) + dVar42 + -1.5;
      dVar202 = dVar98 + dVar98;
      dVar41 = dVar202 * dVar256 + dVar41 * 1.7724538509055159;
      dVar321 = auVar118._8_8_;
      auVar302._8_8_ = dVar321;
      auVar302._0_8_ = dVar321;
      if (dVar91 < 1.35) {
        local_878 = dVar98 * -2.6666666666666665 * dVar41 + 1.0;
      }
      else {
        auVar244._0_8_ = dVar321 / (dVar327 * dVar352);
        auVar162._0_8_ = 1.0 / (dVar327 * dVar352);
        auVar210._8_8_ = dVar352;
        auVar210._0_8_ = dVar327;
        auVar265 = divpd(_DAT_00f4add0,auVar210);
        auVar266 = divpd(auVar265,_DAT_00f570a0);
        auVar162._8_8_ = dVar321;
        auVar162 = divpd(auVar162,_DAT_00f570b0);
        auVar265 = divpd(auVar302,auVar210);
        auVar210 = divpd(auVar265,_DAT_00f570c0);
        auVar244._8_8_ = auVar118._0_8_;
        auVar265 = divpd(auVar244,_DAT_00f570d0);
        local_878 = ((((((auVar266._0_8_ - auVar266._8_8_) + auVar162._0_8_) - auVar162._8_8_) +
                      auVar210._0_8_) - auVar210._8_8_) + auVar265._0_8_) - auVar265._8_8_;
      }
      dVar43 = (double)(~uVar11 & (ulong)(dVar26 * dVar146) | uVar11 & (ulong)(dVar23 * dVar25));
      dVar44 = pow(dVar36,0.2);
      dVar146 = 0.27;
      if (dVar91 <= 0.27) {
        dVar146 = dVar91;
      }
      dVar100 = dVar146 * dVar146;
      dVar45 = exp((-1.0 / dVar100) * 0.25);
      dVar46 = erf((1.0 / dVar146) * 0.5);
      dVar115 = dVar91;
      if (dVar91 <= 0.27) {
        dVar115 = 0.27;
      }
      dVar390 = dVar115 * dVar115;
      dVar417 = dVar390 * dVar390;
      dVar408 = dVar417 * dVar417;
      dVar257 = dVar408 * dVar408;
      auVar266._8_8_ = dVar257 * dVar257;
      auVar266._0_8_ = dVar257;
      auVar265 = divpd(_DAT_00f4add0,auVar266);
      dVar233 = dVar100 * dVar100 * 64.0;
      dVar148 = dVar100 * 20.0 - dVar233;
      dVar233 = dVar100 * -36.0 + dVar146 * 17.724538509055158 * dVar46 + dVar148 * dVar45 + dVar233
                + -3.0;
      dVar353 = auVar265._0_8_;
      dVar264 = auVar265._8_8_;
      auVar413._8_8_ = dVar353;
      auVar413._0_8_ = dVar353;
      if (dVar91 < 0.27) {
        dVar234 = dVar100 * 24.0 * dVar233 + 1.0;
      }
      else {
        auVar214._0_8_ = dVar408 * dVar390;
        auVar214._8_8_ = dVar257 * dVar390;
        auVar268._0_8_ = dVar417 * dVar408;
        auVar211._8_8_ = auVar268._0_8_;
        auVar211._0_8_ = dVar417;
        auVar268._8_8_ = auVar214._0_8_;
        auVar244 = divpd(auVar413,auVar268);
        auVar245 = divpd(auVar244,_DAT_00fb8920);
        auVar294._8_8_ = dVar264 / auVar268._0_8_;
        auVar294._0_8_ = 0x3f55f15f15f15f16;
        auVar295._8_8_ = 0x47b9867eba1668be;
        auVar295._0_8_ = dVar417;
        auVar295 = divpd(auVar294,auVar295);
        auVar272._0_8_ = dVar390 * dVar417;
        auVar335._0_8_ = -dVar353;
        auVar335._8_8_ = dVar353;
        auVar337._8_8_ = dVar408;
        auVar337._0_8_ = auVar272._0_8_;
        auVar244 = divpd(auVar335,auVar337);
        auVar210 = divpd(auVar244,_DAT_00fb8910);
        dVar234 = dVar408 * auVar272._0_8_;
        auVar334._8_8_ = dVar353 / dVar234;
        auVar334._0_8_ = dVar264;
        auVar335 = divpd(auVar334,_DAT_00fb8930);
        auVar340._8_8_ = 0x3ff0000000000000;
        auVar340._0_8_ = dVar264;
        auVar296._8_8_ = auVar214._0_8_;
        auVar296._0_8_ = dVar390;
        auVar336._8_8_ = 0x3ff0000000000000;
        auVar336._0_8_ = dVar264;
        auVar244 = divpd(auVar336,auVar296);
        auVar337 = divpd(auVar244,_DAT_00fb8950);
        auVar267._8_8_ = 0x3ff0000000000000;
        auVar267._0_8_ = dVar264;
        auVar244 = divpd(auVar267,auVar211);
        auVar268 = divpd(auVar244,_DAT_00fb8960);
        auVar272._8_8_ = dVar234;
        auVar212._8_8_ = 0x3ff0000000000000;
        auVar212._0_8_ = dVar264;
        auVar244 = divpd(auVar212,auVar272);
        auVar266 = divpd(auVar244,_DAT_00fb8970);
        auVar299._0_8_ = dVar264 / dVar408;
        auVar299._8_8_ = dVar353;
        auVar244 = divpd(auVar299,_DAT_00fb8980);
        auVar162 = divpd(auVar340,auVar214);
        auVar162 = divpd(auVar162,_DAT_00fb8990);
        dVar234 = auVar162._8_8_ +
                  auVar244._8_8_ +
                  auVar266._8_8_ +
                  auVar268._8_8_ +
                  auVar337._8_8_ +
                  (1.0 / dVar408) * 3.804788961038961e-06 +
                  (1.0 / auVar272._0_8_) / -11520.0 +
                  auVar295._8_8_ + (dVar264 / dVar234) / -3.511556992918352e+39 + auVar295._0_8_ +
                  (dVar353 / dVar417) / 927028425523200.0 +
                  auVar162._0_8_ +
                  auVar244._0_8_ +
                  auVar266._0_8_ +
                  auVar268._0_8_ +
                  auVar337._0_8_ +
                  ((((auVar210._8_8_ + auVar210._0_8_) - auVar245._8_8_) + auVar245._0_8_) -
                  auVar335._8_8_) + auVar335._0_8_;
      }
      dVar149 = 1.0 / dVar44;
      dVar235 = dVar30 * dVar30 * 0.14417005510442776;
      dVar150 = dVar147 * 0.04229627833333333 +
                local_b28 * -0.14554132 * (dVar94 / dVar22) + dVar235;
      dVar44 = 1.0 / (dVar44 * dVar44);
      dVar151 = dVar32 * dVar44;
      dVar30 = 0.32;
      if (dVar91 <= 0.32) {
        dVar30 = dVar91;
      }
      dVar152 = dVar30 * dVar30;
      dVar47 = 1.0 / dVar152;
      dVar48 = exp(dVar47 * -0.25);
      dVar49 = erf((1.0 / dVar30) * 0.5);
      dVar69 = dVar91;
      if (dVar91 <= 0.32) {
        dVar69 = 0.32;
      }
      dVar409 = dVar69 * dVar69;
      dVar418 = dVar409 * dVar409;
      dVar433 = dVar418 * dVar418;
      dVar101 = dVar433 * dVar433;
      dVar258 = 1.0 / dVar101;
      auVar245._0_8_ = 1.0 / (dVar101 * dVar101);
      dVar391 = dVar30 * dVar152;
      dVar328 = dVar152 * dVar152;
      dVar285 = dVar30 * dVar328;
      dVar102 = dVar328 * dVar328;
      dVar442 = dVar30 * dVar102 * -122880.0 +
                dVar328 * dVar391 * 3840.0 + dVar285 * -576.0 + dVar30 * -8.0 + dVar391 * 256.0;
      dVar286 = dVar152 * dVar328;
      dVar287 = dVar286 * 5120.0 + dVar328 * -1440.0 + dVar152 * 224.0 + -35.0;
      dVar236 = dVar152 * 60.0 + -2.0;
      dVar103 = dVar391 * 24.0;
      dVar101 = dVar442 * dVar48 + dVar236 * 3.5449077018110318 * dVar49 + dVar103 * dVar287;
      if (dVar91 < 0.32) {
        dVar203 = dVar30 * 1.1428571428571428 * dVar101 + 1.0;
      }
      else {
        dVar203 = dVar409 * dVar418;
        auVar163._8_8_ = dVar258 / dVar409;
        auVar163._0_8_ = dVar258;
        auVar119._8_8_ = dVar258;
        auVar119._0_8_ = dVar258;
        auVar75._8_8_ = dVar203;
        auVar75._0_8_ = dVar418;
        auVar213._8_8_ = dVar258;
        auVar213._0_8_ = dVar258;
        auVar269._8_8_ = dVar409 * dVar433;
        auVar269._0_8_ = dVar433;
        auVar246._8_8_ = dVar258;
        auVar246._0_8_ = dVar258;
        auVar266 = divpd(auVar246,auVar269);
        auVar297._0_8_ = dVar433 * dVar418;
        auVar297._8_8_ = dVar433 * dVar203;
        auVar244 = divpd(auVar119,auVar297);
        auVar162 = divpd(auVar163,_DAT_00fb89a0);
        auVar210 = divpd(auVar213,auVar75);
        auVar214 = divpd(auVar210,_DAT_00fb89b0);
        auVar268 = divpd(auVar266,_DAT_00fb89c0);
        auVar244 = divpd(auVar244,_DAT_00fb89d0);
        auVar245._8_8_ = auVar245._0_8_ / dVar409;
        auVar266 = divpd(auVar245,_DAT_00fb89e0);
        auVar120._8_8_ = auVar245._0_8_;
        auVar120._0_8_ = auVar245._0_8_;
        auVar210 = divpd(auVar120,auVar75);
        auVar210 = divpd(auVar210,_DAT_00fb89f0);
        dVar203 = ((((((((((((1.0 / auVar297._8_8_) / -115811942400.0 +
                             (1.0 / auVar297._0_8_) / 2530344960.0 +
                             (1.0 / (dVar409 * dVar433)) / -61501440.0 +
                             (1.0 / dVar433) * 5.871587902837903e-07 +
                             (1.0 / dVar203) / -56448.0 + 0.0003826530612244898 / dVar418 +
                            auVar162._0_8_) - auVar162._8_8_) + auVar214._0_8_) - auVar214._8_8_) +
                        auVar268._0_8_) - auVar268._8_8_) + auVar244._0_8_) - auVar244._8_8_) +
                    auVar266._0_8_) - auVar266._8_8_) + auVar210._0_8_) - auVar210._8_8_;
      }
      dVar237 = dVar31 * dVar203 * 1.8171205928321397;
      dVar204 = dVar147 * dVar44;
      dVar238 = dVar237 * 0.026329605555555555 * dVar204 +
                local_878 * dVar149 + dVar150 * dVar234 * 0.43209876543209874 * dVar151;
      dVar50 = dVar27 * dVar43 * -0.36927938319101117;
      uVar15 = -(ulong)(dVar22 <= dVar74);
      dVar1 = p->dens_threshold;
      dVar52 = p->zeta_threshold;
      dVar326 = (double)(uVar9 & (ulong)dVar284 |
                        ~uVar9 & ((ulong)dVar326 & uVar10 | ~uVar10 & (ulong)(dVar145 * -dVar24))) +
                1.0;
      dVar51 = cbrt(dVar326);
      uVar9 = -(ulong)(dVar326 <= dVar52);
      dVar104 = local_c98 * local_c98;
      dVar52 = cbrt(local_c98);
      dVar153 = 1.0 / (dVar52 * dVar52);
      dVar154 = dVar153 / dVar104;
      dVar105 = local_c18 * dVar154;
      dVar205 = (1.0 / dVar52) / (local_c98 * dVar104 * dVar104);
      dVar53 = dVar95 * 0.002689949046226295 * local_c18 * local_c18 * dVar205 +
               dVar35 * dVar105 + 1.0;
      dVar54 = pow(dVar53,0.1);
      dVar351 = (double)((ulong)dVar284 & uVar12 |
                        ~uVar12 & ((~uVar13 & (ulong)dVar351 | uVar13 & (ulong)dVar284) ^
                                  0x8000000000000000)) + 1.0;
      dVar284 = p->zeta_threshold;
      dVar55 = cbrt(dVar351);
      uVar16 = -(ulong)(dVar351 <= dVar284);
      dVar284 = (double)((ulong)dVar25 & uVar16 | ~uVar16 & (ulong)dVar55);
      auVar164._8_8_ = dVar284;
      auVar164._0_8_ = dVar54;
      auVar244 = divpd(_DAT_00f4add0,auVar164);
      dVar351 = auVar244._0_8_;
      dVar144 = auVar244._8_8_;
      dVar54 = (dVar96 * dVar351 * dVar144) / 18.0;
      dVar96 = 1e-10;
      if (1e-10 <= dVar54) {
        dVar96 = dVar54;
      }
      dVar106 = 1.35;
      if (dVar96 <= 1.35) {
        dVar106 = dVar96;
      }
      dVar56 = 1.0 / dVar106;
      dVar57 = erf(dVar56 * 0.5);
      dVar107 = dVar106 * dVar106;
      dVar58 = exp((1.0 / dVar107) * -0.25);
      dVar331 = dVar96;
      if (dVar96 <= 1.35) {
        dVar331 = 1.35;
      }
      dVar376 = dVar331 * dVar331;
      dVar392 = dVar376 * dVar376;
      dVar206 = dVar392 * dVar392;
      auVar121._0_8_ = dVar206 * dVar206;
      auVar121._8_8_ = dVar206;
      auVar244 = divpd(_DAT_00f4add0,auVar121);
      dVar206 = dVar107 * -2.0 * (dVar58 + -1.0) + dVar58 + -1.5;
      dVar57 = dVar57 * 1.7724538509055159 + (dVar106 + dVar106) * dVar206;
      local_638._8_8_ = auVar244._8_8_;
      local_638._0_8_ = local_638._8_8_;
      if (dVar96 < 1.35) {
        local_888 = dVar106 * -2.6666666666666665 * dVar57 + 1.0;
      }
      else {
        auVar76._0_8_ = (double)local_638._8_8_ / (dVar376 * dVar392);
        auVar165._0_8_ = 1.0 / (dVar376 * dVar392);
        auVar122._8_8_ = dVar392;
        auVar122._0_8_ = dVar376;
        auVar210 = divpd(_DAT_00f4add0,auVar122);
        auVar214 = divpd(auVar210,_DAT_00f570a0);
        auVar165._8_8_ = local_638._8_8_;
        auVar162 = divpd(auVar165,_DAT_00f570b0);
        auVar215._8_8_ = local_638._8_8_;
        auVar215._0_8_ = local_638._8_8_;
        auVar210 = divpd(auVar215,auVar122);
        auVar266 = divpd(auVar210,_DAT_00f570c0);
        auVar76._8_8_ = auVar244._0_8_;
        auVar210 = divpd(auVar76,_DAT_00f570d0);
        local_888 = ((((((auVar214._0_8_ - auVar214._8_8_) + auVar162._0_8_) - auVar162._8_8_) +
                      auVar266._0_8_) - auVar266._8_8_) + auVar210._0_8_) - auVar210._8_8_;
      }
      dVar326 = (double)(~uVar9 & (ulong)(dVar326 * dVar51) | (ulong)(dVar23 * dVar25) & uVar9);
      local_188 = (uint)uVar15;
      uStack_184 = (uint)(uVar15 >> 0x20);
      local_9f8 = SUB84(dVar50 * dVar238,0);
      uStack_9f4 = (uint)((ulong)(dVar50 * dVar238) >> 0x20);
      local_6b8 = (double)CONCAT44(~uStack_184 & uStack_9f4,~local_188 & local_9f8);
      dVar59 = pow(dVar53,0.2);
      dVar25 = 0.27;
      if (dVar96 <= 0.27) {
        dVar25 = dVar96;
      }
      dVar108 = dVar25 * dVar25;
      dVar60 = exp((-1.0 / dVar108) * 0.25);
      dVar61 = erf((1.0 / dVar25) * 0.5);
      dVar117 = dVar96;
      if (dVar96 <= 0.27) {
        dVar117 = 0.27;
      }
      dVar393 = dVar117 * dVar117;
      dVar419 = dVar393 * dVar393;
      dVar410 = dVar419 * dVar419;
      dVar288 = dVar410 * dVar410;
      auVar123._8_8_ = dVar288 * dVar288;
      auVar123._0_8_ = dVar288;
      auVar210 = divpd(_DAT_00f4add0,auVar123);
      dVar207 = dVar108 * dVar108 * 64.0;
      dVar155 = dVar108 * 20.0 - dVar207;
      dVar207 = dVar108 * -36.0 + dVar25 * 17.724538509055158 * dVar61 + dVar155 * dVar60 + dVar207
                + -3.0;
      local_468._8_8_ = auVar210._0_8_;
      dVar374 = auVar210._8_8_;
      local_468._0_8_ = local_468._8_8_;
      if (dVar96 < 0.27) {
        dVar239 = dVar108 * 24.0 * dVar207 + 1.0;
      }
      else {
        auVar77._0_8_ = dVar410 * dVar393;
        auVar77._8_8_ = dVar288 * dVar393;
        auVar124._0_8_ = dVar419 * dVar410;
        auVar216._8_8_ = auVar124._0_8_;
        auVar216._0_8_ = dVar419;
        auVar124._8_8_ = auVar77._0_8_;
        auVar247._8_8_ = local_468._8_8_;
        auVar247._0_8_ = local_468._8_8_;
        auVar162 = divpd(auVar247,auVar124);
        auVar295 = divpd(auVar162,_DAT_00fb8920);
        auVar298._8_8_ = dVar374 / auVar124._0_8_;
        auVar298._0_8_ = 0x3f55f15f15f15f16;
        auVar125._8_8_ = 0x47b9867eba1668be;
        auVar125._0_8_ = dVar419;
        auVar299 = divpd(auVar298,auVar125);
        auVar126._0_8_ = dVar393 * dVar419;
        auVar166._0_8_ = -(double)local_468._8_8_;
        auVar166._8_8_ = local_468._8_8_;
        auVar270._8_8_ = dVar410;
        auVar270._0_8_ = auVar126._0_8_;
        auVar162 = divpd(auVar166,auVar270);
        auVar266 = divpd(auVar162,_DAT_00fb8910);
        dVar239 = dVar410 * auVar126._0_8_;
        auVar338._8_8_ = (double)local_468._8_8_ / dVar239;
        auVar338._0_8_ = dVar374;
        auVar335 = divpd(auVar338,_DAT_00fb8930);
        auVar167._8_8_ = 0x3ff0000000000000;
        auVar167._0_8_ = dVar374;
        auVar300._8_8_ = auVar77._0_8_;
        auVar300._0_8_ = dVar393;
        auVar339._8_8_ = 0x3ff0000000000000;
        auVar339._0_8_ = dVar374;
        auVar162 = divpd(auVar339,auVar300);
        auVar340 = divpd(auVar162,_DAT_00fb8950);
        auVar271._8_8_ = 0x3ff0000000000000;
        auVar271._0_8_ = dVar374;
        auVar162 = divpd(auVar271,auVar216);
        auVar272 = divpd(auVar162,_DAT_00fb8960);
        auVar126._8_8_ = dVar239;
        auVar217._8_8_ = 0x3ff0000000000000;
        auVar217._0_8_ = dVar374;
        auVar162 = divpd(auVar217,auVar126);
        auVar268 = divpd(auVar162,_DAT_00fb8970);
        auVar127._0_8_ = dVar374 / dVar410;
        auVar127._8_8_ = local_468._8_8_;
        auVar162 = divpd(auVar127,_DAT_00fb8980);
        auVar214 = divpd(auVar167,auVar77);
        auVar214 = divpd(auVar214,_DAT_00fb8990);
        dVar239 = auVar214._8_8_ +
                  auVar162._8_8_ +
                  auVar268._8_8_ +
                  auVar272._8_8_ +
                  auVar340._8_8_ +
                  (1.0 / dVar410) * 3.804788961038961e-06 +
                  (1.0 / auVar126._0_8_) / -11520.0 +
                  auVar299._8_8_ + (dVar374 / dVar239) / -3.511556992918352e+39 + auVar299._0_8_ +
                  ((double)local_468._8_8_ / dVar419) / 927028425523200.0 +
                  auVar214._0_8_ +
                  auVar162._0_8_ +
                  auVar268._0_8_ +
                  auVar272._0_8_ +
                  auVar340._0_8_ +
                  ((((auVar266._8_8_ + auVar266._0_8_) - auVar295._8_8_) + auVar295._0_8_) -
                  auVar335._8_8_) + auVar335._0_8_;
      }
      dVar208 = 1.0 / dVar59;
      dVar156 = dVar105 * 0.04229627833333333 +
                local_b38 * -0.14554132 * (dVar153 / local_c98) + dVar235;
      dVar59 = 1.0 / (dVar59 * dVar59);
      dVar157 = dVar32 * dVar59;
      dVar235 = 0.32;
      if (dVar96 <= 0.32) {
        dVar235 = dVar96;
      }
      dVar158 = dVar235 * dVar235;
      dVar62 = 1.0 / dVar158;
      dVar63 = exp(dVar62 * -0.25);
      dVar64 = erf((1.0 / dVar235) * 0.5);
      dVar71 = dVar96;
      if (dVar96 <= 0.32) {
        dVar71 = 0.32;
      }
      dVar159 = dVar71 * dVar71;
      dVar354 = dVar159 * dVar159;
      dVar377 = dVar354 * dVar354;
      dVar109 = dVar377 * dVar377;
      dVar289 = 1.0 / dVar109;
      dVar420 = 1.0 / (dVar109 * dVar109);
      dVar421 = dVar235 * dVar158;
      dVar329 = dVar158 * dVar158;
      dVar259 = dVar235 * dVar329;
      dVar110 = dVar329 * dVar329;
      dVar394 = dVar235 * dVar110 * -122880.0 +
                dVar329 * dVar421 * 3840.0 + dVar259 * -576.0 + dVar235 * -8.0 + dVar421 * 256.0;
      dVar240 = dVar158 * dVar329;
      dVar241 = dVar240 * 5120.0 + dVar329 * -1440.0 + dVar158 * 224.0 + -35.0;
      dVar411 = dVar158 * 60.0 + -2.0;
      dVar111 = dVar421 * 24.0;
      dVar109 = dVar394 * dVar63 + dVar411 * 3.5449077018110318 * dVar64 + dVar111 * dVar241;
      if (dVar96 < 0.32) {
        dVar260 = dVar235 * 1.1428571428571428 * dVar109 + 1.0;
      }
      else {
        dVar260 = dVar159 * dVar354;
        auVar248._8_8_ = dVar289 / dVar159;
        auVar248._0_8_ = dVar289;
        auVar128._8_8_ = dVar289;
        auVar128._0_8_ = dVar289;
        auVar78._8_8_ = dVar260;
        auVar78._0_8_ = dVar354;
        auVar273._8_8_ = dVar289;
        auVar273._0_8_ = dVar289;
        auVar359._8_8_ = dVar159 * dVar377;
        auVar359._0_8_ = dVar377;
        auVar341._8_8_ = dVar289;
        auVar341._0_8_ = dVar289;
        auVar268 = divpd(auVar341,auVar359);
        auVar381._0_8_ = dVar377 * dVar354;
        auVar381._8_8_ = dVar377 * dVar260;
        auVar162 = divpd(auVar128,auVar381);
        auVar214 = divpd(auVar248,_DAT_00fb89a0);
        auVar266 = divpd(auVar273,auVar78);
        auVar295 = divpd(auVar266,_DAT_00fb89b0);
        auVar272 = divpd(auVar268,_DAT_00fb89c0);
        auVar162 = divpd(auVar162,_DAT_00fb89d0);
        auVar249._8_8_ = dVar420 / dVar159;
        auVar249._0_8_ = dVar420;
        auVar268 = divpd(auVar249,_DAT_00fb89e0);
        auVar129._8_8_ = dVar420;
        auVar129._0_8_ = dVar420;
        auVar266 = divpd(auVar129,auVar78);
        auVar266 = divpd(auVar266,_DAT_00fb89f0);
        dVar260 = ((((((((((((1.0 / auVar381._8_8_) / -115811942400.0 +
                             (1.0 / auVar381._0_8_) / 2530344960.0 +
                             (1.0 / (dVar159 * dVar377)) / -61501440.0 +
                             (1.0 / dVar377) * 5.871587902837903e-07 +
                             (1.0 / dVar260) / -56448.0 + 0.0003826530612244898 / dVar354 +
                            auVar214._0_8_) - auVar214._8_8_) + auVar295._0_8_) - auVar295._8_8_) +
                        auVar272._0_8_) - auVar272._8_8_) + auVar162._0_8_) - auVar162._8_8_) +
                    auVar268._0_8_) - auVar268._8_8_) + auVar266._0_8_) - auVar266._8_8_;
      }
      dVar261 = dVar31 * dVar260 * 1.8171205928321397;
      dVar242 = dVar105 * dVar59;
      dVar262 = dVar261 * 0.026329605555555555 * dVar242 +
                local_888 * dVar208 + dVar156 * dVar239 * 0.43209876543209874 * dVar157;
      dVar65 = dVar27 * dVar326 * -0.36927938319101117;
      local_6b8 = local_6b8 + (double)(~-(ulong)(local_c98 <= dVar1) & (ulong)(dVar65 * dVar262));
      pdVar3 = out->zk;
      if ((pdVar3 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
        lVar6 = (long)(p->dim).zk * sVar7;
        pdVar3[lVar6] = pdVar3[lVar6] + local_6b8;
      }
      dVar112 = 1.0 / (__x * __x);
      dVar66 = dVar24 * dVar112;
      dVar113 = dVar145 - dVar66;
      bVar4 = dVar23 < dVar200;
      bVar5 = dVar23 < dVar232;
      local_c28 = 0.0;
      dVar232 = 0.0;
      if (bVar5 && bVar4) {
        dVar232 = dVar113;
      }
      dVar160 = 1.0 / (dVar27 * dVar27);
      dVar92 = (dVar29 / __x) * 1.4422495703074083 * dVar92;
      dVar28 = dVar28 * p->cam_omega * 1.4422495703074083;
      dVar161 = dVar160 * dVar43 * 0.9847450218426964 * dVar238 * 0.125;
      dVar327 = dVar327 * dVar67;
      dVar290 = (dVar37 * dVar143 * dVar92) / 54.0;
      dVar114 = (dVar94 / (dVar22 * dVar93)) * local_b98;
      dVar33 = dVar32 * -0.40121303703703703 * dVar114 +
               local_b98 * local_b98 * dVar95 * -0.014346394913206906 *
               ((1.0 / dVar33) / (dVar93 * dVar93 * dVar93));
      dVar38 = 1.0 / (dVar38 * dVar38);
      dVar39 = 1.0 / (dVar39 * dVar39);
      dVar93 = (dVar37 / dVar36) * dVar29;
      if (1e-10 <= dVar97) {
        local_c28 = (dVar37 * dVar29 * dVar28 *
                    (double)(~uVar14 &
                            (ulong)(((double)(~uVar13 & ~uVar12 & (ulong)dVar113) * dVar39) / 3.0))
                    * dVar38) / -18.0 + ((dVar93 * dVar28 * dVar33 * dVar143) / -180.0 - dVar290);
      }
      dVar263 = 1.0 / dVar327;
      auVar79._0_8_ = dVar67 * dVar352;
      auVar168._8_8_ = dVar352 * dVar327;
      auVar168._0_8_ = dVar67;
      dVar352 = 1.0 / auVar79._0_8_;
      auVar79._8_8_ = dVar327;
      auVar162 = divpd(auVar302,auVar79);
      dVar453 = auVar162._8_8_;
      auVar301._8_8_ = 0x3ff0000000000000;
      auVar301._0_8_ = dVar321;
      auVar302 = divpd(auVar301,auVar168);
      auVar118 = divpd(auVar118,auVar168);
      dVar378 = (1.0 / dVar99) * dVar42;
      dVar67 = 1.0 / (dVar99 * dVar98);
      dVar327 = (dVar42 + -1.0) * dVar98 * -4.0;
      dVar256 = dVar256 + dVar256;
      uVar17 = -(ulong)(1.35 < dVar91);
      dVar321 = auVar302._8_8_;
      dVar462 = auVar118._8_8_;
      dVar443 = auVar162._0_8_;
      dVar99 = auVar302._0_8_;
      dVar455 = auVar118._0_8_;
      if (dVar91 < 1.35) {
        dVar68 = (double)(~uVar17 & (ulong)local_c28);
        local_838 = dVar68 * -2.6666666666666665 * dVar41 +
                    dVar98 * -2.6666666666666665 *
                    ((((dVar327 * dVar68 + dVar67 * dVar68 * dVar42 * 0.5) -
                      dVar68 * dVar40 * dVar42) * dVar202 + dVar256 * dVar68) - dVar68 * dVar378);
      }
      else {
        dVar68 = (double)(uVar17 & (ulong)local_c28);
        auVar342._0_8_ = -dVar263 * dVar68;
        auVar342._8_8_ = dVar352 * dVar68;
        auVar302 = divpd(auVar342,_DAT_00f570e0);
        auVar360._0_8_ = dVar99 * dVar68;
        auVar360._8_8_ = dVar321 * dVar68;
        auVar162 = divpd(auVar360,_DAT_00f570f0);
        auVar447._0_8_ = dVar443 * dVar68;
        auVar447._8_8_ = dVar453 * dVar68;
        auVar266 = divpd(auVar447,_DAT_00f57100);
        auVar80._0_8_ = dVar68 * dVar455;
        auVar80._8_8_ = dVar68 * dVar462;
        auVar118 = divpd(auVar80,_DAT_00f57110);
        local_838 = ((((((auVar302._8_8_ + auVar302._0_8_) - auVar162._8_8_) + auVar162._0_8_) -
                      auVar266._8_8_) + auVar266._0_8_) - auVar118._8_8_) + auVar118._0_8_;
      }
      auVar169._0_8_ = dVar257 * dVar115;
      auVar169._8_8_ = dVar417 * dVar115;
      auVar343._0_8_ = dVar408 * auVar169._8_8_;
      dVar257 = dVar264 / auVar343._0_8_;
      dVar390 = dVar390 * dVar115;
      auVar81._0_8_ = dVar390 * dVar417;
      auVar81._8_8_ = dVar115 * dVar408;
      dVar417 = 1.0 / auVar81._8_8_;
      auVar361._8_8_ = auVar81._0_8_;
      auVar361._0_8_ = dVar390;
      auVar274._0_8_ = dVar408 * dVar390;
      auVar274._8_8_ = dVar408 * auVar81._0_8_;
      dVar408 = dVar264 / auVar274._8_8_;
      auVar382._8_8_ = auVar343._0_8_;
      auVar382._0_8_ = auVar274._0_8_;
      auVar162 = divpd(auVar413,auVar382);
      auVar426._8_8_ = dVar264;
      auVar426._0_8_ = 0x3ff0000000000000;
      auVar343._8_8_ = dVar115;
      auVar130._8_8_ = dVar264;
      auVar130._0_8_ = 0x3ff0000000000000;
      auVar118 = divpd(auVar130,auVar343);
      auVar218._8_8_ = dVar353;
      auVar218._0_8_ = 0x3ff0000000000000;
      auVar302 = divpd(auVar218,auVar274);
      dVar456 = dVar264 / auVar274._0_8_;
      auVar275._8_8_ = dVar390;
      auVar275._0_8_ = auVar274._8_8_;
      auVar459._8_8_ = dVar264;
      auVar459._0_8_ = 0x3ff0000000000000;
      auVar268 = divpd(auVar459,auVar275);
      auVar266 = divpd(auVar265,auVar361);
      dVar322 = auVar266._8_8_;
      dVar264 = 1.0 / auVar81._0_8_;
      dVar379 = (1.0 / auVar169._8_8_) * -0.005357142857142857;
      auVar413 = divpd(auVar413,auVar81);
      auVar214 = divpd(auVar426,auVar169);
      dVar431 = auVar214._8_8_;
      auVar82._8_8_ = auVar81._8_8_;
      auVar82._0_8_ = auVar169._8_8_;
      auVar265 = divpd(auVar265,auVar82);
      dVar233 = dVar233 * dVar146;
      dVar355 = dVar146 * dVar100 * 256.0;
      dVar148 = (1.0 / (dVar146 * dVar100)) * dVar148;
      dVar115 = (1.0 / dVar146) * dVar45 * -10.0;
      uVar18 = -(ulong)(0.27 < dVar91);
      dVar353 = auVar302._8_8_;
      local_6f8 = auVar413._0_8_;
      dStack_6f0 = auVar413._8_8_;
      local_608 = auVar162._0_8_;
      dStack_600 = auVar162._8_8_;
      local_718 = auVar118._0_8_;
      dStack_710 = auVar118._8_8_;
      local_898 = auVar268._0_8_;
      dStack_890 = auVar268._8_8_;
      local_5e8 = auVar265._0_8_;
      dStack_5e0 = auVar265._8_8_;
      dVar68 = auVar266._0_8_;
      dVar422 = auVar214._0_8_;
      dVar390 = auVar302._0_8_;
      if (dVar91 < 0.27) {
        dVar330 = (double)(~uVar18 & (ulong)local_c28);
        local_848 = dVar233 * 48.0 * dVar330 +
                    dVar100 * 24.0 *
                    (dVar115 * dVar330 +
                    dVar330 * 10.0 * 1.7724538509055159 * dVar46 +
                    dVar146 * dVar330 * -72.0 +
                    (dVar146 * dVar330 * 40.0 - dVar355 * dVar330) * dVar45 +
                    dVar45 * dVar330 * dVar148 * 0.5 + dVar355 * dVar330);
      }
      else {
        dVar330 = (double)(uVar18 & (ulong)local_c28);
        auVar437._0_8_ = local_6f8 * dVar330;
        auVar437._8_8_ = dStack_6f0 * dVar330;
        auVar268 = divpd(auVar437,_DAT_00fb8a30);
        auVar448._0_8_ = local_608 * dVar330;
        auVar448._8_8_ = dStack_600 * dVar330;
        auVar295 = divpd(auVar448,_DAT_00fb8a40);
        auVar131._0_8_ = -dVar257 * dVar330;
        auVar131._8_8_ = dVar408 * dVar330;
        auVar118 = divpd(auVar131,_DAT_00fb8a50);
        auVar219._0_8_ = dVar390 * dVar330;
        auVar219._8_8_ = dVar353 * dVar330;
        auVar302 = divpd(auVar219,_DAT_00fb8a60);
        auVar362._0_8_ = local_718 * dVar330;
        auVar362._8_8_ = dStack_710 * dVar330;
        auVar413 = divpd(auVar362,_DAT_00fb8a70);
        auVar132._0_8_ = local_898 * dVar330;
        auVar132._8_8_ = dStack_890 * dVar330;
        auVar265 = divpd(auVar132,_DAT_00fb8a80);
        auVar427._0_8_ = dVar422 * dVar330;
        auVar427._8_8_ = dVar431 * dVar330;
        auVar214 = divpd(auVar427,_DAT_00fb8a90);
        auVar303._0_8_ = dVar68 * dVar330;
        auVar303._8_8_ = dVar322 * dVar330;
        auVar162 = divpd(auVar303,_DAT_00fb8aa0);
        auVar344._0_8_ = dVar330 * local_5e8;
        auVar344._8_8_ = dVar330 * dStack_5e0;
        auVar266 = divpd(auVar344,_DAT_00fb8ab0);
        local_848 = auVar266._8_8_ +
                    auVar162._8_8_ +
                    auVar214._8_8_ +
                    auVar265._8_8_ +
                    auVar413._8_8_ +
                    auVar302._8_8_ +
                    (((auVar268._0_8_ - auVar268._8_8_) + auVar295._0_8_) - auVar295._8_8_) +
                    (dVar456 * dVar330) / 8.121312287389663e+33 +
                    auVar266._0_8_ +
                    auVar162._0_8_ +
                    auVar214._0_8_ +
                    auVar265._0_8_ +
                    auVar413._0_8_ +
                    auVar302._0_8_ +
                    dVar417 * -3.0438311688311688e-05 * dVar330 +
                    (dVar264 * dVar330) / 1920.0 +
                    dVar379 * dVar330 + auVar118._8_8_ + auVar118._0_8_;
      }
      auVar250._0_8_ = dVar409 * dVar69;
      auVar250._8_8_ = dVar69;
      auVar414._0_8_ = dVar418 * auVar250._0_8_;
      auVar414._8_8_ = dVar418 * dVar69;
      dVar409 = 1.0 / auVar414._0_8_;
      auVar83._0_8_ = auVar250._0_8_ * dVar433;
      auVar83._8_8_ = dVar69 * dVar433;
      dVar418 = 1.0 / auVar83._0_8_;
      auVar438._8_8_ = dVar258;
      auVar438._0_8_ = dVar258;
      auVar428._8_8_ = dVar258;
      auVar428._0_8_ = dVar258;
      auVar162 = divpd(auVar428,auVar83);
      dVar432 = auVar162._8_8_;
      dVar330 = 1.0 / auVar83._8_8_;
      auVar276._0_8_ = dVar433 * auVar414._0_8_;
      auVar276._8_8_ = dVar433 * auVar414._8_8_;
      dVar457 = 1.0 / auVar276._8_8_;
      dVar69 = 1.0 / auVar276._0_8_;
      auVar363._8_8_ = dVar258;
      auVar363._0_8_ = dVar258;
      auVar302 = divpd(auVar363,auVar250);
      dVar375 = auVar302._8_8_;
      auVar449._8_8_ = dVar258;
      auVar449._0_8_ = dVar258;
      auVar413 = divpd(auVar449,auVar414);
      dVar454 = auVar413._8_8_;
      auVar266 = divpd(auVar438,auVar276);
      auVar304._8_8_ = auVar245._0_8_;
      auVar304._0_8_ = auVar245._0_8_;
      auVar277._8_8_ = auVar245._0_8_;
      auVar277._0_8_ = auVar245._0_8_;
      auVar118 = divpd(auVar277,auVar250);
      dVar433 = auVar118._8_8_;
      auVar265 = divpd(auVar304,auVar414);
      dVar380 = (1.0 / auVar414._8_8_) * -0.001530612244897959;
      dVar442 = (1.0 / dVar391) * dVar442;
      dVar287 = dVar287 * dVar152 * 72.0;
      dVar258 = dVar30 * 1.7724538509055159 * 240.0;
      dVar395 = dVar236 * dVar48 * -2.0;
      uVar19 = -(ulong)(0.32 < dVar91);
      dVar441 = auVar266._8_8_;
      dVar323 = auVar265._8_8_;
      dVar356 = auVar302._0_8_;
      dVar444 = auVar413._0_8_;
      dVar423 = auVar162._0_8_;
      dVar236 = auVar118._0_8_;
      dVar434 = auVar266._0_8_;
      dVar291 = auVar265._0_8_;
      if (dVar91 < 0.32) {
        local_c28 = (double)(~uVar19 & (ulong)local_c28);
        dVar70 = local_c28 * 1.1428571428571428 * dVar101 +
                 dVar30 * 1.1428571428571428 *
                 (dVar47 * local_c28 * dVar395 +
                 dVar258 * local_c28 * dVar49 +
                 (dVar285 * local_c28 * 30720.0 +
                 dVar30 * local_c28 * 448.0 + dVar391 * local_c28 * -5760.0) * dVar103 +
                 dVar287 * local_c28 +
                 (dVar152 * local_c28 * 768.0 +
                 local_c28 * -8.0 +
                 dVar328 * local_c28 * -2880.0 +
                 dVar102 * -1105920.0 * local_c28 + dVar286 * 26880.0 * local_c28) * dVar48 +
                 dVar48 * local_c28 * dVar442 * 0.5);
      }
      else {
        local_c28 = (double)((ulong)local_c28 & uVar19);
        auVar364._0_8_ = dVar356 * local_c28;
        auVar364._8_8_ = dVar375 * local_c28;
        auVar302 = divpd(auVar364,_DAT_00fb8ac0);
        auVar450._0_8_ = dVar444 * local_c28;
        auVar450._8_8_ = dVar454 * local_c28;
        auVar413 = divpd(auVar450,_DAT_00fb8ad0);
        auVar429._0_8_ = dVar423 * local_c28;
        auVar429._8_8_ = dVar432 * local_c28;
        auVar162 = divpd(auVar429,_DAT_00fb8ae0);
        auVar439._0_8_ = dVar434 * local_c28;
        auVar439._8_8_ = dVar441 * local_c28;
        auVar266 = divpd(auVar439,_DAT_00fb8af0);
        auVar278._0_8_ = dVar236 * local_c28;
        auVar278._8_8_ = dVar433 * local_c28;
        auVar265 = divpd(auVar278,_DAT_00fb8b00);
        auVar170._0_8_ = local_c28 * dVar291;
        auVar170._8_8_ = local_c28 * dVar323;
        auVar118 = divpd(auVar170,_DAT_00fb8b10);
        dVar70 = (((((((((((((local_c28 * dVar69) / 8272281600.0 +
                            (dVar457 * local_c28) / -210862080.0 +
                            (dVar418 * local_c28) / 6150144.0 +
                            dVar330 * -4.6972703222703225e-06 * local_c28 +
                            dVar380 * local_c28 + (dVar409 * local_c28) / 9408.0) - auVar302._8_8_)
                          + auVar302._0_8_) - auVar413._8_8_) + auVar413._0_8_) - auVar162._8_8_) +
                      auVar162._0_8_) - auVar266._8_8_) + auVar266._0_8_) - auVar265._8_8_) +
                  auVar265._0_8_) - auVar118._8_8_) + auVar118._0_8_;
      }
      local_878 = local_878 * (dVar149 / dVar36);
      dVar36 = dVar44 / dVar36;
      dVar424 = dVar150 * dVar234 * 1.8171205928321397 * -0.1728395061728395;
      local_288 = 0.0;
      local_298 = 0.0;
      if (dVar74 < dVar22) {
        local_298 = (dVar33 * dVar36 * dVar147 * dVar237 * -0.010531842222222223 +
                    dVar70 * 1.8171205928321397 * dVar31 * 0.026329605555555555 * dVar204 +
                    dVar33 * dVar31 * dVar36 * dVar424 +
                    (local_b28 * 0.24256886666666666 * dVar34 + dVar114 * -0.11279007555555555) *
                    dVar234 * 0.43209876543209874 * dVar151 +
                    local_848 * dVar150 * 0.43209876543209874 * dVar151 +
                    local_838 * dVar149 + (dVar33 * local_878) / -5.0 +
                    dVar114 * dVar44 * dVar237 * -0.07021228148148148) * dVar50 +
                    ((double)(~uVar11 & (ulong)(dVar232 * dVar26 * 1.3333333333333333)) * dVar27 *
                     -0.36927938319101117 * dVar238 - dVar161);
      }
      dVar112 = dVar112 * -dVar24;
      if (dVar23 < dVar200) {
        local_288 = (double)(~uVar10 & (ulong)(-dVar145 - dVar112));
      }
      dVar23 = dVar160 * dVar326 * 0.9847450218426964 * dVar262 * 0.125;
      dVar376 = dVar376 * dVar331;
      dVar33 = (dVar92 * dVar351 * dVar144) / 54.0;
      dVar92 = 1.0 / (dVar284 * dVar284);
      dVar24 = 1.0 / (dVar55 * dVar55);
      local_c38 = 0.0;
      if (1e-10 <= dVar54) {
        local_c38 = (dVar29 * dVar351 * dVar28 *
                    (double)(~uVar16 &
                            (ulong)(((double)(~uVar12 & ~uVar13 & (ulong)-dVar113) * dVar24) / 3.0))
                    * dVar92) / -18.0 - dVar33;
      }
      dVar200 = 1.0 / dVar376;
      auVar84._0_8_ = dVar331 * dVar392;
      auVar398._8_8_ = dVar392 * dVar376;
      auVar398._0_8_ = dVar331;
      dVar114 = 1.0 / auVar84._0_8_;
      auVar84._8_8_ = dVar376;
      auVar265 = divpd(local_638._0_16_,auVar84);
      dVar376 = auVar265._8_8_;
      auVar279._8_8_ = 0x3ff0000000000000;
      auVar279._0_8_ = local_638._8_8_;
      auVar118 = divpd(auVar279,auVar398);
      auVar302 = divpd(auVar244,auVar398);
      dVar55 = (1.0 / dVar107) * dVar58;
      dVar160 = 1.0 / (dVar107 * dVar106);
      dVar107 = (dVar58 + -1.0) * dVar106 * -4.0;
      uVar10 = -(ulong)(1.35 < dVar96);
      dVar284 = auVar118._8_8_;
      dVar113 = auVar302._8_8_;
      dVar331 = auVar265._0_8_;
      dVar232 = auVar118._0_8_;
      dVar392 = auVar302._0_8_;
      if (dVar96 < 1.35) {
        dVar116 = (double)(~uVar10 & (ulong)local_c38);
        dVar70 = (dVar107 * dVar116 + dVar160 * dVar116 * dVar58 * 0.5) - dVar116 * dVar56 * dVar58;
        dVar70 = dVar106 * -2.6666666666666665 *
                 ((dVar70 + dVar70) * dVar106 + ((dVar116 + dVar116) * dVar206 - dVar116 * dVar55));
        dVar116 = dVar116 * -2.6666666666666665 * dVar57;
      }
      else {
        dVar70 = (double)(uVar10 & (ulong)local_c38);
        auVar251._0_8_ = -dVar200 * dVar70;
        auVar251._8_8_ = dVar114 * dVar70;
        auVar265 = divpd(auVar251,_DAT_00f570e0);
        auVar365._0_8_ = dVar232 * dVar70;
        auVar365._8_8_ = dVar284 * dVar70;
        auVar244 = divpd(auVar365,_DAT_00f570f0);
        auVar345._0_8_ = dVar331 * dVar70;
        auVar345._8_8_ = dVar376 * dVar70;
        auVar302 = divpd(auVar345,_DAT_00f57100);
        auVar85._0_8_ = dVar70 * dVar392;
        auVar85._8_8_ = dVar70 * dVar113;
        auVar118 = divpd(auVar85,_DAT_00f57110);
        dVar70 = auVar118._0_8_;
        dVar116 = (((((auVar265._8_8_ + auVar265._0_8_) - auVar244._8_8_) + auVar244._0_8_) -
                   auVar302._8_8_) + auVar302._0_8_) - auVar118._8_8_;
      }
      auVar171._0_8_ = dVar288 * dVar117;
      auVar171._8_8_ = dVar419 * dVar117;
      auVar252._0_8_ = dVar410 * auVar171._8_8_;
      dVar288 = dVar374 / auVar252._0_8_;
      dVar393 = dVar393 * dVar117;
      auVar86._0_8_ = dVar393 * dVar419;
      auVar86._8_8_ = dVar117 * dVar410;
      dVar209 = 1.0 / auVar86._8_8_;
      auVar366._8_8_ = auVar86._0_8_;
      auVar366._0_8_ = dVar393;
      auVar451._0_8_ = dVar410 * dVar393;
      auVar451._8_8_ = dVar410 * auVar86._0_8_;
      dVar410 = dVar374 / auVar451._8_8_;
      auVar383._8_8_ = auVar252._0_8_;
      auVar383._0_8_ = auVar451._0_8_;
      auVar118 = divpd(local_468._0_16_,auVar383);
      dVar419 = auVar118._8_8_;
      auVar305._8_8_ = dVar374;
      auVar305._0_8_ = 0x3ff0000000000000;
      auVar252._8_8_ = dVar117;
      auVar384._8_8_ = dVar374;
      auVar384._0_8_ = 0x3ff0000000000000;
      auVar266 = divpd(auVar384,auVar252);
      auVar399._8_8_ = local_468._8_8_;
      auVar399._0_8_ = 0x3ff0000000000000;
      auVar413 = divpd(auVar399,auVar451);
      dVar406 = auVar413._8_8_;
      dVar435 = dVar374 / auVar451._0_8_;
      auVar452._8_8_ = dVar393;
      auVar452._0_8_ = auVar451._8_8_;
      auVar346._8_8_ = dVar374;
      auVar346._0_8_ = 0x3ff0000000000000;
      auVar162 = divpd(auVar346,auVar452);
      auVar265 = divpd(auVar210,auVar366);
      dVar445 = 1.0 / auVar86._0_8_;
      dVar425 = (1.0 / auVar171._8_8_) * -0.005357142857142857;
      auVar214 = divpd(local_468._0_16_,auVar86);
      auVar244 = divpd(auVar305,auVar171);
      auVar87._8_8_ = auVar86._8_8_;
      auVar87._0_8_ = auVar171._8_8_;
      auVar302 = divpd(auVar210,auVar87);
      dVar207 = dVar207 * dVar25;
      dVar332 = auVar162._0_8_;
      dVar350 = auVar162._8_8_;
      dVar357 = dVar25 * dVar108 * 256.0;
      dVar155 = (1.0 / (dVar25 * dVar108)) * dVar155;
      dVar333 = (1.0 / dVar25) * dVar60 * -10.0;
      uVar20 = -(ulong)(0.27 < dVar96);
      dVar324 = auVar244._8_8_;
      dVar374 = auVar302._8_8_;
      local_a28 = auVar214._0_8_;
      dStack_a20 = auVar214._8_8_;
      local_7a8 = auVar266._0_8_;
      dStack_7a0 = auVar266._8_8_;
      local_a58 = auVar265._0_8_;
      dStack_a50 = auVar265._8_8_;
      dVar396 = auVar413._0_8_;
      dVar292 = auVar244._0_8_;
      dVar117 = auVar118._0_8_;
      dVar393 = auVar302._0_8_;
      if (dVar96 < 0.27) {
        dVar243 = (double)(~uVar20 & (ulong)local_c38);
        local_2b8 = dVar207 * 48.0 * dVar243 +
                    (dVar333 * dVar243 +
                    dVar243 * 10.0 * 1.7724538509055159 * dVar61 +
                    dVar25 * dVar243 * -72.0 +
                    (dVar25 * dVar243 * 40.0 - dVar357 * dVar243) * dVar60 +
                    dVar60 * dVar243 * dVar155 * 0.5 + dVar357 * dVar243) * 24.0 * dVar108;
      }
      else {
        dVar243 = (double)(uVar20 & (ulong)local_c38);
        auVar430._0_8_ = local_a28 * dVar243;
        auVar430._8_8_ = dStack_a20 * dVar243;
        auVar214 = divpd(auVar430,_DAT_00fb8a30);
        auVar133._0_8_ = dVar117 * dVar243;
        auVar133._8_8_ = dVar419 * dVar243;
        auVar118 = divpd(auVar133,_DAT_00fb8a40);
        auVar220._0_8_ = -dVar288 * dVar243;
        auVar220._8_8_ = dVar410 * dVar243;
        auVar265 = divpd(auVar220,_DAT_00fb8a50);
        auVar400._0_8_ = dVar396 * dVar243;
        auVar400._8_8_ = dVar406 * dVar243;
        auVar413 = divpd(auVar400,_DAT_00fb8a60);
        auVar367._0_8_ = local_7a8 * dVar243;
        auVar367._8_8_ = dStack_7a0 * dVar243;
        auVar266 = divpd(auVar367,_DAT_00fb8a70);
        auVar221._0_8_ = dVar332 * dVar243;
        auVar221._8_8_ = dVar350 * dVar243;
        auVar302 = divpd(auVar221,_DAT_00fb8a80);
        auVar306._0_8_ = dVar292 * dVar243;
        auVar306._8_8_ = dVar324 * dVar243;
        auVar162 = divpd(auVar306,_DAT_00fb8a90);
        auVar222._0_8_ = local_a58 * dVar243;
        auVar222._8_8_ = dStack_a50 * dVar243;
        auVar244 = divpd(auVar222,_DAT_00fb8aa0);
        auVar253._0_8_ = dVar243 * dVar393;
        auVar253._8_8_ = dVar243 * dVar374;
        auVar210 = divpd(auVar253,_DAT_00fb8ab0);
        local_2b8 = auVar210._8_8_ +
                    auVar244._8_8_ +
                    auVar162._8_8_ +
                    auVar302._8_8_ +
                    auVar266._8_8_ +
                    auVar413._8_8_ +
                    (((auVar214._0_8_ - auVar214._8_8_) + auVar118._0_8_) - auVar118._8_8_) +
                    (dVar435 * dVar243) / 8.121312287389663e+33 +
                    auVar210._0_8_ +
                    auVar244._0_8_ +
                    auVar162._0_8_ +
                    auVar302._0_8_ +
                    auVar266._0_8_ +
                    auVar413._0_8_ +
                    dVar209 * -3.0438311688311688e-05 * dVar243 +
                    (dVar445 * dVar243) / 1920.0 +
                    dVar425 * dVar243 + auVar265._8_8_ + auVar265._0_8_;
      }
      auVar134._0_8_ = dVar159 * dVar71;
      auVar134._8_8_ = dVar71;
      auVar347._0_8_ = dVar354 * auVar134._0_8_;
      auVar347._8_8_ = dVar354 * dVar71;
      dVar159 = 1.0 / auVar347._0_8_;
      auVar88._0_8_ = auVar134._0_8_ * dVar377;
      auVar88._8_8_ = dVar71 * dVar377;
      dVar446 = 1.0 / auVar88._0_8_;
      auVar460._8_8_ = dVar289;
      auVar460._0_8_ = dVar289;
      auVar401._8_8_ = dVar289;
      auVar401._0_8_ = dVar289;
      auVar210 = divpd(auVar401,auVar88);
      dVar354 = 1.0 / auVar88._8_8_;
      auVar280._0_8_ = dVar377 * auVar347._0_8_;
      auVar280._8_8_ = dVar377 * auVar347._8_8_;
      dVar377 = 1.0 / auVar280._8_8_;
      dVar71 = 1.0 / auVar280._0_8_;
      auVar89._8_8_ = dVar289;
      auVar89._0_8_ = dVar289;
      auVar118 = divpd(auVar89,auVar134);
      auVar254._8_8_ = dVar289;
      auVar254._0_8_ = dVar289;
      auVar265 = divpd(auVar254,auVar347);
      auVar162 = divpd(auVar460,auVar280);
      auVar307._8_8_ = dVar420;
      auVar307._0_8_ = dVar420;
      auVar281._8_8_ = dVar420;
      auVar281._0_8_ = dVar420;
      auVar302 = divpd(auVar281,auVar134);
      dVar243 = auVar302._8_8_;
      auVar244 = divpd(auVar307,auVar347);
      dVar289 = (1.0 / auVar347._8_8_) * -0.001530612244897959;
      dVar394 = (1.0 / dVar421) * dVar394;
      dVar436 = dVar241 * dVar158 * 72.0;
      dVar412 = dVar235 * 1.7724538509055159 * 240.0;
      dVar358 = dVar411 * dVar63 * -2.0;
      uVar21 = -(ulong)(0.32 < dVar96);
      dVar411 = auVar265._8_8_;
      dVar407 = auVar210._8_8_;
      dVar463 = auVar162._8_8_;
      dVar325 = auVar244._8_8_;
      local_7f8 = auVar118._0_8_;
      dStack_7f0 = auVar118._8_8_;
      dVar420 = auVar302._0_8_;
      dVar241 = auVar265._0_8_;
      dVar397 = auVar210._0_8_;
      dVar458 = auVar162._0_8_;
      dVar293 = auVar244._0_8_;
      if (dVar96 < 0.32) {
        local_c38 = (double)(~uVar21 & (ulong)local_c38);
        dVar72 = local_c38 * 1.1428571428571428 * dVar109 +
                 dVar235 * 1.1428571428571428 *
                 (dVar62 * local_c38 * dVar358 +
                 dVar412 * local_c38 * dVar64 +
                 (dVar259 * local_c38 * 30720.0 +
                 dVar235 * local_c38 * 448.0 + dVar421 * local_c38 * -5760.0) * dVar111 +
                 dVar436 * local_c38 +
                 (dVar329 * local_c38 * -2880.0 +
                 dVar158 * local_c38 * 768.0 +
                 local_c38 * -8.0 + local_c38 * -1105920.0 * dVar110 + local_c38 * 26880.0 * dVar240
                 ) * dVar63 + dVar63 * local_c38 * dVar394 * 0.5);
      }
      else {
        local_c38 = (double)((ulong)local_c38 & uVar21);
        auVar172._0_8_ = local_7f8 * local_c38;
        auVar172._8_8_ = dStack_7f0 * local_c38;
        auVar118 = divpd(auVar172,_DAT_00fb8ac0);
        auVar255._0_8_ = dVar241 * local_c38;
        auVar255._8_8_ = dVar411 * local_c38;
        auVar244 = divpd(auVar255,_DAT_00fb8ad0);
        auVar173._0_8_ = dVar397 * local_c38;
        auVar173._8_8_ = dVar407 * local_c38;
        auVar265 = divpd(auVar173,_DAT_00fb8ae0);
        auVar174._0_8_ = dVar458 * local_c38;
        auVar174._8_8_ = dVar463 * local_c38;
        auVar302 = divpd(auVar174,_DAT_00fb8af0);
        auVar282._0_8_ = dVar420 * local_c38;
        auVar282._8_8_ = dVar243 * local_c38;
        auVar210 = divpd(auVar282,_DAT_00fb8b00);
        auVar348._0_8_ = local_c38 * dVar293;
        auVar348._8_8_ = local_c38 * dVar325;
        auVar162 = divpd(auVar348,_DAT_00fb8b10);
        dVar72 = (((((((((((((local_c38 * dVar71) / 8272281600.0 +
                            (dVar377 * local_c38) / -210862080.0 +
                            (dVar446 * local_c38) / 6150144.0 +
                            dVar354 * -4.6972703222703225e-06 * local_c38 +
                            dVar289 * local_c38 + (dVar159 * local_c38) / 9408.0) - auVar118._8_8_)
                          + auVar118._0_8_) - auVar244._8_8_) + auVar244._0_8_) - auVar265._8_8_) +
                      auVar265._0_8_) - auVar302._8_8_) + auVar302._0_8_) - auVar210._8_8_) +
                  auVar210._0_8_) - auVar162._8_8_) + auVar162._0_8_;
      }
      dVar73 = 0.0;
      if (dVar1 < local_c98) {
        dVar73 = (dVar72 * 1.8171205928321397 * dVar31 * 0.026329605555555555 * dVar242 +
                 (dVar116 + dVar70) * dVar208 + local_2b8 * dVar156 * 0.43209876543209874 * dVar157)
                 * dVar65 +
                 ((double)(~uVar9 & (ulong)(local_288 * dVar51 * 1.3333333333333333)) * dVar27 *
                  -0.36927938319101117 * dVar262 - dVar23);
      }
      pdVar3 = out->vrho;
      if ((pdVar3 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
        lVar6 = (long)(p->dim).vrho * sVar7;
        pdVar3[lVar6] = (local_298 + dVar73) * __x + local_6b8 + pdVar3[lVar6];
      }
      dVar66 = -dVar145 - dVar66;
      dVar116 = 0.0;
      dVar70 = 0.0;
      if (bVar5 && bVar4) {
        dVar70 = dVar66;
      }
      if (1e-10 <= dVar97) {
        dVar116 = (dVar37 * dVar29 * dVar28 *
                  (double)(~uVar14 &
                          (ulong)((dVar39 * (double)(~uVar13 & ~uVar12 & (ulong)dVar66)) / 3.0)) *
                  dVar38) / -18.0 - dVar290;
      }
      if (dVar91 < 1.35) {
        dVar38 = (double)(~uVar17 & (ulong)dVar116);
        dVar37 = dVar98 * -2.6666666666666665 *
                 ((((dVar327 * dVar38 + dVar67 * dVar38 * dVar42 * 0.5) - dVar38 * dVar40 * dVar42)
                   * dVar202 + dVar256 * dVar38) - dVar38 * dVar378);
        dVar38 = dVar38 * -2.6666666666666665 * dVar41;
      }
      else {
        dVar37 = (double)(uVar17 & (ulong)dVar116);
        auVar308._0_8_ = -dVar263 * dVar37;
        auVar308._8_8_ = dVar352 * dVar37;
        auVar265 = divpd(auVar308,_DAT_00f570e0);
        auVar368._0_8_ = dVar99 * dVar37;
        auVar368._8_8_ = dVar321 * dVar37;
        auVar244 = divpd(auVar368,_DAT_00f570f0);
        auVar309._0_8_ = dVar443 * dVar37;
        auVar309._8_8_ = dVar453 * dVar37;
        auVar302 = divpd(auVar309,_DAT_00f57100);
        auVar223._0_8_ = dVar37 * dVar455;
        auVar223._8_8_ = dVar37 * dVar462;
        auVar118 = divpd(auVar223,_DAT_00f57110);
        dVar37 = auVar118._0_8_;
        dVar38 = (((((auVar265._8_8_ + auVar265._0_8_) - auVar244._8_8_) + auVar244._0_8_) -
                  auVar302._8_8_) + auVar302._0_8_) - auVar118._8_8_;
      }
      if (dVar91 < 0.27) {
        dVar290 = (double)(~uVar18 & (ulong)dVar116);
        dVar39 = (dVar290 * dVar115 +
                 dVar290 * 10.0 * 1.7724538509055159 * dVar46 +
                 dVar146 * dVar290 * -72.0 +
                 (dVar146 * dVar290 * 40.0 - dVar355 * dVar290) * dVar45 +
                 dVar45 * dVar290 * dVar148 * 0.5 + dVar355 * dVar290) * 24.0 * dVar100;
        dVar290 = dVar290 * 48.0 * dVar233;
      }
      else {
        dVar290 = (double)(uVar18 & (ulong)dVar116);
        auVar402._0_8_ = local_6f8 * dVar290;
        auVar402._8_8_ = dStack_6f0 * dVar290;
        auVar162 = divpd(auVar402,_DAT_00fb8a30);
        auVar310._0_8_ = local_608 * dVar290;
        auVar310._8_8_ = dStack_600 * dVar290;
        auVar265 = divpd(auVar310,_DAT_00fb8a40);
        auVar415._0_8_ = -dVar257 * dVar290;
        auVar415._8_8_ = dVar408 * dVar290;
        auVar214 = divpd(auVar415,_DAT_00fb8a50);
        auVar369._0_8_ = dVar390 * dVar290;
        auVar369._8_8_ = dVar353 * dVar290;
        auVar302 = divpd(auVar369,_DAT_00fb8a60);
        auVar403._0_8_ = local_718 * dVar290;
        auVar403._8_8_ = dStack_710 * dVar290;
        auVar266 = divpd(auVar403,_DAT_00fb8a70);
        auVar370._0_8_ = local_898 * dVar290;
        auVar370._8_8_ = dStack_890 * dVar290;
        auVar244 = divpd(auVar370,_DAT_00fb8a80);
        auVar404._0_8_ = dVar422 * dVar290;
        auVar404._8_8_ = dVar431 * dVar290;
        auVar413 = divpd(auVar404,_DAT_00fb8a90);
        auVar371._0_8_ = dVar68 * dVar290;
        auVar371._8_8_ = dVar322 * dVar290;
        auVar210 = divpd(auVar371,_DAT_00fb8aa0);
        auVar224._0_8_ = dVar290 * local_5e8;
        auVar224._8_8_ = dVar290 * dStack_5e0;
        auVar118 = divpd(auVar224,_DAT_00fb8ab0);
        dVar39 = auVar118._0_8_ +
                 auVar210._0_8_ +
                 auVar413._0_8_ +
                 auVar244._0_8_ +
                 auVar266._0_8_ +
                 auVar302._0_8_ +
                 dVar417 * dVar290 * -3.0438311688311688e-05 +
                 (dVar290 * dVar264) / 1920.0 + dVar379 * dVar290 + auVar214._8_8_ + auVar214._0_8_;
        dVar290 = auVar118._8_8_ +
                  auVar210._8_8_ +
                  auVar413._8_8_ +
                  auVar244._8_8_ +
                  auVar266._8_8_ +
                  auVar302._8_8_ +
                  (((auVar162._0_8_ - auVar162._8_8_) + auVar265._0_8_) - auVar265._8_8_) +
                  (dVar456 * dVar290) / 8.121312287389663e+33;
      }
      if (dVar91 < 0.32) {
        dVar116 = (double)(~uVar19 & (ulong)dVar116);
        dVar116 = dVar116 * 1.1428571428571428 * dVar101 +
                  dVar30 * 1.1428571428571428 *
                  (dVar47 * dVar116 * dVar395 +
                  dVar49 * dVar116 * dVar258 +
                  (dVar285 * dVar116 * 30720.0 +
                  dVar30 * dVar116 * 448.0 + dVar391 * dVar116 * -5760.0) * dVar103 +
                  dVar287 * dVar116 +
                  (dVar286 * dVar116 * 26880.0 +
                  dVar328 * dVar116 * -2880.0 +
                  dVar152 * dVar116 * 768.0 + dVar116 * -1105920.0 * dVar102 + dVar116 * -8.0) *
                  dVar48 + dVar48 * dVar116 * dVar442 * 0.5);
      }
      else {
        dVar116 = (double)((ulong)dVar116 & uVar19);
        auVar311._0_8_ = dVar356 * dVar116;
        auVar311._8_8_ = dVar375 * dVar116;
        auVar265 = divpd(auVar311,_DAT_00fb8ac0);
        auVar312._0_8_ = dVar444 * dVar116;
        auVar312._8_8_ = dVar454 * dVar116;
        auVar302 = divpd(auVar312,_DAT_00fb8ad0);
        auVar313._0_8_ = dVar423 * dVar116;
        auVar313._8_8_ = dVar432 * dVar116;
        auVar244 = divpd(auVar313,_DAT_00fb8ae0);
        auVar314._0_8_ = dVar434 * dVar116;
        auVar314._8_8_ = dVar441 * dVar116;
        auVar210 = divpd(auVar314,_DAT_00fb8af0);
        auVar315._0_8_ = dVar236 * dVar116;
        auVar315._8_8_ = dVar433 * dVar116;
        auVar162 = divpd(auVar315,_DAT_00fb8b00);
        auVar90._0_8_ = dVar116 * dVar291;
        auVar90._8_8_ = dVar116 * dVar323;
        auVar118 = divpd(auVar90,_DAT_00fb8b10);
        dVar116 = (((((((((((((dVar116 * dVar69) / 8272281600.0 +
                             (dVar457 * dVar116) / -210862080.0 +
                             (dVar418 * dVar116) / 6150144.0 +
                             dVar330 * dVar116 * -4.6972703222703225e-06 +
                             dVar380 * dVar116 + (dVar409 * dVar116) / 9408.0) - auVar265._8_8_) +
                           auVar265._0_8_) - auVar302._8_8_) + auVar302._0_8_) - auVar244._8_8_) +
                       auVar244._0_8_) - auVar210._8_8_) + auVar210._0_8_) - auVar162._8_8_) +
                   auVar162._0_8_) - auVar118._8_8_) + auVar118._0_8_;
      }
      dVar73 = 0.0;
      dVar72 = 0.0;
      if (dVar74 < dVar22) {
        dVar72 = (dVar116 * 1.8171205928321397 * dVar31 * 0.026329605555555555 * dVar204 +
                 (dVar38 + dVar37) * dVar149 +
                 (dVar290 + dVar39) * dVar150 * 0.43209876543209874 * dVar151) * dVar50 +
                 ((double)(~uVar11 & (ulong)(dVar26 * 1.3333333333333333 * dVar70)) * dVar27 *
                  -0.36927938319101117 * dVar238 - dVar161);
      }
      dVar26 = 0.0;
      if (bVar5 && bVar4) {
        dVar26 = dVar145 - dVar112;
      }
      dVar38 = dVar29 * (dVar351 / dVar53);
      dVar37 = (dVar153 / (local_c98 * dVar104)) * local_c18;
      dVar32 = dVar32 * -0.40121303703703703 * dVar37 +
               local_c18 * local_c18 * dVar95 * -0.014346394913206906 *
               ((1.0 / dVar52) / (dVar104 * dVar104 * dVar104));
      if (1e-10 <= dVar54) {
        auVar175._0_8_ = dVar32 * dVar144 * dVar28 * dVar38;
        auVar175._8_8_ =
             (double)(~uVar16 &
                     (ulong)(((double)(~uVar12 & ~uVar13 & (ulong)-dVar66) * dVar24) / 3.0)) *
             dVar92 * dVar28 * dVar29 * dVar351;
        auVar118 = divpd(auVar175,_DAT_00fb8e00);
        dVar73 = (-dVar33 - auVar118._0_8_) - auVar118._8_8_;
      }
      dVar55 = -dVar55;
      if (dVar96 < 1.35) {
        dVar29 = (double)(~uVar10 & (ulong)dVar73);
        dVar24 = (dVar107 * dVar29 + dVar160 * dVar29 * dVar58 * 0.5) - dVar29 * dVar56 * dVar58;
        dVar24 = dVar106 * -2.6666666666666665 *
                 ((dVar24 + dVar24) * dVar106 + dVar55 * dVar29 + (dVar29 + dVar29) * dVar206);
        dVar29 = dVar29 * -2.6666666666666665 * dVar57;
      }
      else {
        dVar24 = (double)(uVar10 & (ulong)dVar73);
        auVar225._0_8_ = -dVar200 * dVar24;
        auVar225._8_8_ = dVar114 * dVar24;
        auVar265 = divpd(auVar225,_DAT_00f570e0);
        auVar316._0_8_ = dVar232 * dVar24;
        auVar316._8_8_ = dVar284 * dVar24;
        auVar244 = divpd(auVar316,_DAT_00f570f0);
        auVar226._0_8_ = dVar331 * dVar24;
        auVar226._8_8_ = dVar376 * dVar24;
        auVar302 = divpd(auVar226,_DAT_00f57100);
        auVar176._0_8_ = dVar24 * dVar392;
        auVar176._8_8_ = dVar24 * dVar113;
        auVar118 = divpd(auVar176,_DAT_00f57110);
        dVar24 = auVar118._0_8_;
        dVar29 = (((((auVar265._8_8_ + auVar265._0_8_) - auVar244._8_8_) + auVar244._0_8_) -
                  auVar302._8_8_) + auVar302._0_8_) - auVar118._8_8_;
      }
      if (dVar96 < 0.27) {
        dVar33 = (double)(~uVar20 & (ulong)dVar73);
        dVar33 = dVar207 * 48.0 * dVar33 +
                 (dVar333 * dVar33 +
                 dVar33 * 10.0 * 1.7724538509055159 * dVar61 +
                 dVar25 * dVar33 * -72.0 +
                 (dVar25 * dVar33 * 40.0 - dVar357 * dVar33) * dVar60 +
                 dVar60 * dVar33 * dVar155 * 0.5 + dVar357 * dVar33) * 24.0 * dVar108;
      }
      else {
        dVar33 = (double)(uVar20 & (ulong)dVar73);
        auVar385._0_8_ = local_a28 * dVar33;
        auVar385._8_8_ = dStack_a20 * dVar33;
        auVar162 = divpd(auVar385,_DAT_00fb8a30);
        auVar227._0_8_ = dVar117 * dVar33;
        auVar227._8_8_ = dVar419 * dVar33;
        auVar265 = divpd(auVar227,_DAT_00fb8a40);
        auVar416._0_8_ = -dVar288 * dVar33;
        auVar416._8_8_ = dVar410 * dVar33;
        auVar214 = divpd(auVar416,_DAT_00fb8a50);
        auVar317._0_8_ = dVar396 * dVar33;
        auVar317._8_8_ = dVar406 * dVar33;
        auVar302 = divpd(auVar317,_DAT_00fb8a60);
        auVar386._0_8_ = local_7a8 * dVar33;
        auVar386._8_8_ = dStack_7a0 * dVar33;
        auVar266 = divpd(auVar386,_DAT_00fb8a70);
        auVar318._0_8_ = dVar332 * dVar33;
        auVar318._8_8_ = dVar350 * dVar33;
        auVar244 = divpd(auVar318,_DAT_00fb8a80);
        auVar387._0_8_ = dVar292 * dVar33;
        auVar387._8_8_ = dVar324 * dVar33;
        auVar413 = divpd(auVar387,_DAT_00fb8a90);
        auVar319._0_8_ = local_a58 * dVar33;
        auVar319._8_8_ = dStack_a50 * dVar33;
        auVar210 = divpd(auVar319,_DAT_00fb8aa0);
        auVar177._0_8_ = dVar33 * dVar393;
        auVar177._8_8_ = dVar33 * dVar374;
        auVar118 = divpd(auVar177,_DAT_00fb8ab0);
        dVar33 = auVar118._8_8_ +
                 auVar210._8_8_ +
                 auVar413._8_8_ +
                 auVar244._8_8_ +
                 auVar266._8_8_ +
                 auVar302._8_8_ +
                 (((auVar162._0_8_ - auVar162._8_8_) + auVar265._0_8_) - auVar265._8_8_) +
                 (dVar435 * dVar33) / 8.121312287389663e+33 +
                 auVar118._0_8_ +
                 auVar210._0_8_ +
                 auVar413._0_8_ +
                 auVar244._0_8_ +
                 auVar266._0_8_ +
                 auVar302._0_8_ +
                 dVar209 * dVar33 * -3.0438311688311688e-05 +
                 (dVar33 * dVar445) / 1920.0 + dVar425 * dVar33 + auVar214._8_8_ + auVar214._0_8_;
      }
      if (dVar96 < 0.32) {
        dVar73 = (double)(~uVar21 & (ulong)dVar73);
        dVar92 = dVar235 * 1.1428571428571428 *
                 (dVar62 * dVar73 * dVar358 +
                 dVar64 * dVar73 * dVar412 +
                 (dVar259 * dVar73 * 30720.0 + dVar235 * dVar73 * 448.0 + dVar421 * dVar73 * -5760.0
                 ) * dVar111 +
                 dVar436 * dVar73 +
                 (dVar240 * dVar73 * 26880.0 +
                 dVar329 * dVar73 * -2880.0 +
                 dVar158 * dVar73 * 768.0 + dVar73 * -1105920.0 * dVar110 + dVar73 * -8.0) * dVar63
                 + dVar63 * dVar73 * dVar394 * 0.5);
        dVar39 = dVar73 * 1.1428571428571428 * dVar109;
      }
      else {
        dVar73 = (double)((ulong)dVar73 & uVar21);
        auVar178._0_8_ = local_7f8 * dVar73;
        auVar178._8_8_ = dStack_7f0 * dVar73;
        auVar118 = divpd(auVar178,_DAT_00fb8ac0);
        auVar179._0_8_ = dVar241 * dVar73;
        auVar179._8_8_ = dVar411 * dVar73;
        auVar265 = divpd(auVar179,_DAT_00fb8ad0);
        auVar180._0_8_ = dVar397 * dVar73;
        auVar180._8_8_ = dVar407 * dVar73;
        auVar302 = divpd(auVar180,_DAT_00fb8ae0);
        auVar181._0_8_ = dVar458 * dVar73;
        auVar181._8_8_ = dVar463 * dVar73;
        auVar244 = divpd(auVar181,_DAT_00fb8af0);
        auVar182._0_8_ = dVar420 * dVar73;
        auVar182._8_8_ = dVar243 * dVar73;
        auVar210 = divpd(auVar182,_DAT_00fb8b00);
        auVar372._0_8_ = dVar73 * dVar293;
        auVar372._8_8_ = dVar73 * dVar325;
        auVar162 = divpd(auVar372,_DAT_00fb8b10);
        dVar92 = auVar162._0_8_;
        dVar39 = ((((((((((((dVar73 * dVar71) / 8272281600.0 +
                           (dVar377 * dVar73) / -210862080.0 +
                           (dVar446 * dVar73) / 6150144.0 +
                           dVar354 * dVar73 * -4.6972703222703225e-06 +
                           dVar289 * dVar73 + (dVar159 * dVar73) / 9408.0) - auVar118._8_8_) +
                         auVar118._0_8_) - auVar265._8_8_) + auVar265._0_8_) - auVar302._8_8_) +
                     auVar302._0_8_) - auVar244._8_8_) + auVar244._0_8_) - auVar210._8_8_) +
                 auVar210._0_8_) - auVar162._8_8_;
      }
      local_888 = local_888 * (dVar208 / dVar53);
      dVar53 = dVar59 / dVar53;
      dVar145 = dVar156 * dVar239 * 1.8171205928321397 * -0.1728395061728395;
      dVar351 = 0.0;
      if (dVar1 < local_c98) {
        dVar351 = (dVar32 * dVar53 * dVar105 * dVar261 * -0.010531842222222223 +
                  (dVar39 + dVar92) * 1.8171205928321397 * dVar31 * 0.026329605555555555 * dVar242 +
                  dVar32 * dVar31 * dVar53 * dVar145 +
                  (local_b38 * 0.24256886666666666 * dVar154 + dVar37 * -0.11279007555555555) *
                  dVar239 * 0.43209876543209874 * dVar157 +
                  dVar33 * dVar156 * 0.43209876543209874 * dVar157 +
                  (dVar29 + dVar24) * dVar208 + (dVar32 * local_888) / -5.0 +
                  dVar37 * dVar59 * dVar261 * -0.07021228148148148) * dVar65 +
                  ((double)(~uVar9 & (ulong)(dVar26 * dVar51 * 1.3333333333333333)) * dVar27 *
                   -0.36927938319101117 * dVar262 - dVar23);
      }
      if ((pdVar3 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
        lVar6 = (long)(p->dim).vrho * sVar7;
        pdVar3[lVar6 + 1] = (dVar72 + dVar351) * __x + local_6b8 + pdVar3[lVar6 + 1];
      }
      dVar23 = dVar35 * dVar34 + dVar201 * local_b98 * dVar95 * 0.00537989809245259;
      dVar24 = 0.0;
      if (1e-10 <= dVar97) {
        dVar24 = (dVar93 * dVar28 * dVar143 * dVar23) / -180.0;
      }
      if (dVar91 < 1.35) {
        dVar26 = (double)(~uVar17 & (ulong)dVar24);
        dVar26 = dVar41 * dVar26 * -2.6666666666666665 +
                 dVar98 * -2.6666666666666665 *
                 ((dVar202 * ((dVar327 * dVar26 + dVar67 * dVar26 * dVar42 * 0.5) -
                             dVar40 * dVar26 * dVar42) + dVar256 * dVar26) - dVar378 * dVar26);
      }
      else {
        dVar26 = (double)(uVar17 & (ulong)dVar24);
        auVar228._0_8_ = -dVar263 * dVar26;
        auVar228._8_8_ = dVar352 * dVar26;
        auVar302 = divpd(auVar228,_DAT_00f570e0);
        auVar405._0_8_ = dVar99 * dVar26;
        auVar405._8_8_ = dVar321 * dVar26;
        auVar244 = divpd(auVar405,_DAT_00f570f0);
        auVar183._0_8_ = dVar443 * dVar26;
        auVar183._8_8_ = dVar453 * dVar26;
        auVar265 = divpd(auVar183,_DAT_00f57100);
        auVar135._0_8_ = dVar455 * dVar26;
        auVar135._8_8_ = dVar462 * dVar26;
        auVar118 = divpd(auVar135,_DAT_00f57110);
        dVar26 = ((((((auVar302._8_8_ + auVar302._0_8_) - auVar244._8_8_) + auVar244._0_8_) -
                   auVar265._8_8_) + auVar265._0_8_) - auVar118._8_8_) + auVar118._0_8_;
      }
      if (dVar91 < 0.27) {
        dVar29 = (double)(~uVar18 & (ulong)dVar24);
        dVar100 = dVar100 * (dVar115 * dVar29 +
                            dVar29 * 10.0 * 1.7724538509055159 * dVar46 +
                            dVar146 * dVar29 * -72.0 +
                            dVar148 * dVar45 * dVar29 * 0.5 +
                            (dVar146 * dVar29 * 40.0 - dVar355 * dVar29) * dVar45 + dVar355 * dVar29
                            ) * 24.0;
        dVar233 = dVar29 * 48.0 * dVar233;
      }
      else {
        dVar29 = (double)(uVar18 & (ulong)dVar24);
        auVar184._0_8_ = local_6f8 * dVar29;
        auVar184._8_8_ = dStack_6f0 * dVar29;
        auVar118 = divpd(auVar184,_DAT_00fb8a30);
        auVar185._0_8_ = local_608 * dVar29;
        auVar185._8_8_ = dStack_600 * dVar29;
        auVar265 = divpd(auVar185,_DAT_00fb8a40);
        auVar186._0_8_ = -dVar257 * dVar29;
        auVar186._8_8_ = dVar408 * dVar29;
        auVar302 = divpd(auVar186,_DAT_00fb8a50);
        auVar229._0_8_ = dVar390 * dVar29;
        auVar229._8_8_ = dVar353 * dVar29;
        auVar266 = divpd(auVar229,_DAT_00fb8a60);
        auVar187._0_8_ = local_718 * dVar29;
        auVar187._8_8_ = dStack_710 * dVar29;
        auVar244 = divpd(auVar187,_DAT_00fb8a70);
        auVar440._0_8_ = local_898 * dVar29;
        auVar440._8_8_ = dStack_890 * dVar29;
        auVar214 = divpd(auVar440,_DAT_00fb8a80);
        auVar188._0_8_ = dVar422 * dVar29;
        auVar188._8_8_ = dVar431 * dVar29;
        auVar210 = divpd(auVar188,_DAT_00fb8a90);
        auVar230._0_8_ = dVar68 * dVar29;
        auVar230._8_8_ = dVar322 * dVar29;
        auVar413 = divpd(auVar230,_DAT_00fb8aa0);
        auVar189._0_8_ = local_5e8 * dVar29;
        auVar189._8_8_ = dStack_5e0 * dVar29;
        auVar162 = divpd(auVar189,_DAT_00fb8ab0);
        dVar100 = auVar162._0_8_ +
                  auVar413._0_8_ +
                  auVar210._0_8_ +
                  auVar214._0_8_ +
                  auVar244._0_8_ +
                  auVar266._0_8_ +
                  dVar417 * dVar29 * -3.0438311688311688e-05 +
                  (dVar264 * dVar29) / 1920.0 + dVar379 * dVar29 + auVar302._8_8_ + auVar302._0_8_;
        dVar233 = auVar162._8_8_ +
                  auVar413._8_8_ +
                  auVar210._8_8_ +
                  auVar214._8_8_ +
                  auVar244._8_8_ +
                  auVar266._8_8_ +
                  (((auVar118._0_8_ - auVar118._8_8_) + auVar265._0_8_) - auVar265._8_8_) +
                  (dVar456 * dVar29) / 8.121312287389663e+33;
      }
      if (dVar91 < 0.32) {
        dVar24 = (double)(~uVar19 & (ulong)dVar24);
        dVar91 = dVar24 * 1.1428571428571428 * dVar101 +
                 dVar30 * 1.1428571428571428 *
                 (dVar395 * dVar47 * dVar24 +
                 dVar258 * dVar49 * dVar24 +
                 dVar103 * (dVar285 * dVar24 * 30720.0 +
                           dVar30 * dVar24 * 448.0 + dVar391 * dVar24 * -5760.0) +
                 dVar287 * dVar24 +
                 dVar442 * dVar48 * dVar24 * 0.5 +
                 (dVar286 * dVar24 * 26880.0 +
                 dVar328 * dVar24 * -2880.0 +
                 dVar152 * dVar24 * 768.0 + dVar24 * -1105920.0 * dVar102 + dVar24 * -8.0) * dVar48)
        ;
      }
      else {
        dVar24 = (double)(uVar19 & (ulong)dVar24);
        auVar190._0_8_ = dVar356 * dVar24;
        auVar190._8_8_ = dVar375 * dVar24;
        auVar118 = divpd(auVar190,_DAT_00fb8ac0);
        auVar191._0_8_ = dVar444 * dVar24;
        auVar191._8_8_ = dVar454 * dVar24;
        auVar265 = divpd(auVar191,_DAT_00fb8ad0);
        auVar373._0_8_ = dVar423 * dVar24;
        auVar373._8_8_ = dVar432 * dVar24;
        auVar210 = divpd(auVar373,_DAT_00fb8ae0);
        auVar192._0_8_ = dVar434 * dVar24;
        auVar192._8_8_ = dVar441 * dVar24;
        auVar302 = divpd(auVar192,_DAT_00fb8af0);
        auVar388._0_8_ = dVar236 * dVar24;
        auVar388._8_8_ = dVar433 * dVar24;
        auVar162 = divpd(auVar388,_DAT_00fb8b00);
        auVar193._0_8_ = dVar291 * dVar24;
        auVar193._8_8_ = dVar323 * dVar24;
        auVar244 = divpd(auVar193,_DAT_00fb8b10);
        dVar91 = (((((((((((((dVar69 * dVar24) / 8272281600.0 +
                            (dVar457 * dVar24) / -210862080.0 +
                            (dVar418 * dVar24) / 6150144.0 +
                            dVar330 * dVar24 * -4.6972703222703225e-06 +
                            dVar380 * dVar24 + (dVar409 * dVar24) / 9408.0) - auVar118._8_8_) +
                          auVar118._0_8_) - auVar265._8_8_) + auVar265._0_8_) - auVar210._8_8_) +
                      auVar210._0_8_) - auVar302._8_8_) + auVar302._0_8_) - auVar162._8_8_) +
                  auVar162._0_8_) - auVar244._8_8_) + auVar244._0_8_;
      }
      dVar24 = 0.0;
      if (dVar74 < dVar22) {
        dVar24 = dVar50 * (dVar237 * -0.010531842222222223 * dVar147 * dVar36 * dVar23 +
                          dVar91 * 1.8171205928321397 * dVar31 * 0.026329605555555555 * dVar204 +
                          dVar424 * dVar31 * dVar36 * dVar23 +
                          dVar34 * dVar234 * 0.018276169650205763 * dVar151 +
                          dVar150 * (dVar233 + dVar100) * 0.43209876543209874 * dVar151 +
                          dVar26 * dVar149 + (local_878 * dVar23) / -5.0 +
                          dVar31 * dVar34 * dVar44 *
                          dVar203 * 1.8171205928321397 * 0.026329605555555555);
      }
      pdVar3 = out->vsigma;
      if ((pdVar3 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
        lVar6 = (long)(p->dim).vsigma * sVar7;
        dVar74 = (pdVar3 + lVar6)[1];
        pdVar3[lVar6] = dVar24 * __x + pdVar3[lVar6];
        (pdVar3 + lVar6)[1] = dVar74 + 0.0;
      }
      dVar23 = dVar35 * dVar154 + dVar95 * 0.00537989809245259 * local_c18 * dVar205;
      dVar74 = 0.0;
      if (1e-10 <= dVar54) {
        dVar74 = (dVar38 * dVar28 * dVar144 * dVar23) / -180.0;
      }
      if (dVar96 < 1.35) {
        dVar24 = (double)(~uVar10 & (ulong)dVar74);
        dVar91 = (dVar107 * dVar24 + dVar160 * dVar24 * dVar58 * 0.5) - dVar56 * dVar24 * dVar58;
        dVar91 = dVar106 * -2.6666666666666665 *
                 ((dVar91 + dVar91) * dVar106 + dVar55 * dVar24 + dVar206 * (dVar24 + dVar24));
        dVar57 = dVar24 * -2.6666666666666665 * dVar57;
      }
      else {
        dVar91 = (double)(uVar10 & (ulong)dVar74);
        auVar136._0_8_ = -dVar200 * dVar91;
        auVar136._8_8_ = dVar114 * dVar91;
        auVar118 = divpd(auVar136,_DAT_00f570e0);
        auVar349._0_8_ = dVar232 * dVar91;
        auVar349._8_8_ = dVar284 * dVar91;
        auVar244 = divpd(auVar349,_DAT_00f570f0);
        auVar320._0_8_ = dVar331 * dVar91;
        auVar320._8_8_ = dVar376 * dVar91;
        auVar302 = divpd(auVar320,_DAT_00f57100);
        auVar194._0_8_ = dVar392 * dVar91;
        auVar194._8_8_ = dVar113 * dVar91;
        auVar265 = divpd(auVar194,_DAT_00f57110);
        dVar91 = auVar265._0_8_;
        dVar57 = (((((auVar118._8_8_ + auVar118._0_8_) - auVar244._8_8_) + auVar244._0_8_) -
                  auVar302._8_8_) + auVar302._0_8_) - auVar265._8_8_;
      }
      if (dVar96 < 0.27) {
        dVar24 = (double)(~uVar20 & (ulong)dVar74);
        dVar108 = dVar108 * (dVar333 * dVar24 +
                            dVar24 * 10.0 * 1.7724538509055159 * dVar61 +
                            dVar25 * dVar24 * -72.0 +
                            dVar155 * dVar60 * dVar24 * 0.5 +
                            (dVar25 * dVar24 * 40.0 - dVar357 * dVar24) * dVar60 + dVar357 * dVar24)
                            * 24.0;
        dVar24 = dVar207 * 48.0 * dVar24;
      }
      else {
        dVar24 = (double)(uVar20 & (ulong)dVar74);
        auVar461._0_8_ = local_a28 * dVar24;
        auVar461._8_8_ = dStack_a20 * dVar24;
        auVar214 = divpd(auVar461,_DAT_00fb8a30);
        auVar137._0_8_ = dVar117 * dVar24;
        auVar137._8_8_ = dVar419 * dVar24;
        auVar118 = divpd(auVar137,_DAT_00fb8a40);
        auVar195._0_8_ = -dVar288 * dVar24;
        auVar195._8_8_ = dVar410 * dVar24;
        auVar244 = divpd(auVar195,_DAT_00fb8a50);
        auVar196._0_8_ = dVar396 * dVar24;
        auVar196._8_8_ = dVar406 * dVar24;
        auVar210 = divpd(auVar196,_DAT_00fb8a60);
        auVar138._0_8_ = local_7a8 * dVar24;
        auVar138._8_8_ = dStack_7a0 * dVar24;
        auVar265 = divpd(auVar138,_DAT_00fb8a70);
        auVar197._0_8_ = dVar332 * dVar24;
        auVar197._8_8_ = dVar350 * dVar24;
        auVar162 = divpd(auVar197,_DAT_00fb8a80);
        auVar139._0_8_ = dVar292 * dVar24;
        auVar139._8_8_ = dVar324 * dVar24;
        auVar302 = divpd(auVar139,_DAT_00fb8a90);
        auVar283._0_8_ = local_a58 * dVar24;
        auVar283._8_8_ = dStack_a50 * dVar24;
        auVar413 = divpd(auVar283,_DAT_00fb8aa0);
        auVar198._0_8_ = dVar393 * dVar24;
        auVar198._8_8_ = dVar374 * dVar24;
        auVar266 = divpd(auVar198,_DAT_00fb8ab0);
        dVar108 = auVar266._0_8_ +
                  auVar413._0_8_ +
                  auVar302._0_8_ +
                  auVar162._0_8_ +
                  auVar265._0_8_ +
                  auVar210._0_8_ +
                  dVar209 * dVar24 * -3.0438311688311688e-05 +
                  (dVar445 * dVar24) / 1920.0 + dVar425 * dVar24 + auVar244._8_8_ + auVar244._0_8_;
        dVar24 = auVar266._8_8_ +
                 auVar413._8_8_ +
                 auVar302._8_8_ +
                 auVar162._8_8_ +
                 auVar265._8_8_ +
                 auVar210._8_8_ +
                 (((auVar214._0_8_ - auVar214._8_8_) + auVar118._0_8_) - auVar118._8_8_) +
                 (dVar435 * dVar24) / 8.121312287389663e+33;
      }
      if (dVar96 < 0.32) {
        dVar74 = (double)(~uVar21 & (ulong)dVar74);
        dVar74 = dVar74 * 1.1428571428571428 * dVar109 +
                 dVar235 * 1.1428571428571428 *
                 (dVar358 * dVar62 * dVar74 +
                 dVar412 * dVar64 * dVar74 +
                 dVar111 * (dVar259 * dVar74 * 30720.0 +
                           dVar235 * dVar74 * 448.0 + dVar421 * dVar74 * -5760.0) +
                 dVar436 * dVar74 +
                 dVar394 * dVar63 * dVar74 * 0.5 +
                 (dVar240 * dVar74 * 26880.0 +
                 dVar329 * dVar74 * -2880.0 +
                 dVar158 * dVar74 * 768.0 + dVar74 * -1105920.0 * dVar110 + dVar74 * -8.0) * dVar63)
        ;
      }
      else {
        dVar74 = (double)(uVar21 & (ulong)dVar74);
        auVar231._0_8_ = local_7f8 * dVar74;
        auVar231._8_8_ = dStack_7f0 * dVar74;
        auVar210 = divpd(auVar231,_DAT_00fb8ac0);
        auVar389._0_8_ = dVar241 * dVar74;
        auVar389._8_8_ = dVar411 * dVar74;
        auVar162 = divpd(auVar389,_DAT_00fb8ad0);
        auVar140._0_8_ = dVar397 * dVar74;
        auVar140._8_8_ = dVar407 * dVar74;
        auVar118 = divpd(auVar140,_DAT_00fb8ae0);
        auVar141._0_8_ = dVar458 * dVar74;
        auVar141._8_8_ = dVar463 * dVar74;
        auVar265 = divpd(auVar141,_DAT_00fb8af0);
        auVar199._0_8_ = dVar420 * dVar74;
        auVar199._8_8_ = dVar243 * dVar74;
        auVar244 = divpd(auVar199,_DAT_00fb8b00);
        auVar142._0_8_ = dVar293 * dVar74;
        auVar142._8_8_ = dVar325 * dVar74;
        auVar302 = divpd(auVar142,_DAT_00fb8b10);
        dVar74 = (((((((((((((dVar71 * dVar74) / 8272281600.0 +
                            (dVar377 * dVar74) / -210862080.0 +
                            (dVar446 * dVar74) / 6150144.0 +
                            dVar354 * dVar74 * -4.6972703222703225e-06 +
                            dVar289 * dVar74 + (dVar159 * dVar74) / 9408.0) - auVar210._8_8_) +
                          auVar210._0_8_) - auVar162._8_8_) + auVar162._0_8_) - auVar118._8_8_) +
                      auVar118._0_8_) - auVar265._8_8_) + auVar265._0_8_) - auVar244._8_8_) +
                  auVar244._0_8_) - auVar302._8_8_) + auVar302._0_8_;
      }
      dVar25 = 0.0;
      if (dVar1 < local_c98) {
        dVar25 = dVar65 * (dVar261 * -0.010531842222222223 * dVar105 * dVar53 * dVar23 +
                          dVar74 * 1.8171205928321397 * dVar31 * 0.026329605555555555 * dVar242 +
                          dVar145 * dVar31 * dVar53 * dVar23 +
                          dVar154 * dVar239 * 0.018276169650205763 * dVar157 +
                          dVar156 * (dVar24 + dVar108) * 0.43209876543209874 * dVar157 +
                          (dVar57 + dVar91) * dVar208 + (local_888 * dVar23) / -5.0 +
                          dVar31 * dVar154 * dVar59 *
                          dVar260 * 1.8171205928321397 * 0.026329605555555555);
      }
      if ((pdVar3 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
        lVar6 = (long)(p->dim).vsigma * sVar7;
        pdVar3[lVar6 + 2] = dVar25 * __x + pdVar3[lVar6 + 2];
      }
      pdVar3 = out->vlapl;
      if ((pdVar3 != (double *)0x0) && ((~p->info->flags & 0x8002U) == 0)) {
        lVar6 = (long)(p->dim).vlapl * sVar7;
        dVar74 = (pdVar3 + lVar6)[1];
        pdVar3[lVar6] = pdVar3[lVar6] + 0.0;
        (pdVar3 + lVar6)[1] = dVar74 + 0.0;
      }
      pdVar3 = out->vtau;
      if ((pdVar3 != (double *)0x0) && ((~p->info->flags & 0x10002U) == 0)) {
        lVar6 = (long)(p->dim).vtau * sVar7;
        pdVar3[lVar6] =
             (double)(~uVar15 &
                     (ulong)((dVar94 / dVar22) * 1.8171205928321397 * dVar44 * dVar31 *
                            dVar234 * dVar27 * dVar43 * 1.4422495703074083 * 0.01610215409462904)) *
             __x + pdVar3[lVar6];
      }
      if ((pdVar3 != (double *)0x0) && ((~p->info->flags & 0x10002U) == 0)) {
        lVar6 = (long)(p->dim).vtau * sVar7;
        pdVar3[lVar6 + 1] =
             __x * (double)(~-(ulong)(local_c98 <= dVar1) &
                           (ulong)((dVar153 / local_c98) * 1.8171205928321397 * dVar31 * dVar59 *
                                  dVar27 * dVar239 * dVar326 * 1.4422495703074083 *
                                  0.01610215409462904)) + pdVar3[lVar6 + 1];
      }
    }
  }
  return;
}

Assistant:

static void
WORK_MGGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np,
 const double *rho, const double *sigma, const double *lapl, const double *tau,
 xc_mgga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  //feenableexcept(FE_DIVBYZERO | FE_INVALID | FE_OVERFLOW);
#endif

  size_t ip;
  double dens;
  double my_rho[2]={0.0, 0.0};
  double my_sigma[3]={0.0, 0.0, 0.0};
  double my_tau[2]={0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;

    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));

    /* Many functionals shamelessly divide by tau, so we set a reasonable threshold */
    /* skip all checks on tau for the kinetic functionals */
    if(p->info->flags & XC_FLAGS_NEEDS_TAU){
      my_tau[0] = m_max(p->tau_threshold, VAR(tau, ip, 0));
      if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
        /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
        my_sigma[0] = m_min(my_sigma[0], 8.0*my_rho[0]*my_tau[0]);
      }
    }
    /* lapl can have any values */

    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      if(p->info->flags & XC_FLAGS_NEEDS_TAU){
        my_tau[1] = m_max(p->tau_threshold, VAR(tau, ip, 1));
        if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
          /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
          my_sigma[2] = m_min(my_sigma[2], 8.0*my_rho[1]*my_tau[1]);
        }
      }
      
      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, &VAR(lapl, ip, 0), my_tau, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
          for(ii=0; ii < dim->vlapl; ii++)
            is_OK = is_OK && isfinite(out->VAR(vlapl, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_TAU)
          for(ii=0; ii < dim->vtau; ii++)
            is_OK = is_OK && isfinite(out->VAR(vtau, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0), VAR(tau, ip, 0));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0));
          else
            printf("%le 0.0 %le 0.0 0.0 0.0 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(tau, ip, 0));
        }else{
          printf("./xc-get_data %d 2 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le %le %le %le %le %le %le %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le %le %le %le %le %le %le 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1));
          else
            printf("%le %le %le %le %le 0.0 0.0 %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}